

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

bool embree::avx2::CurveNvIntersectorK<4,8>::
     occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx2::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [32];
  float *pfVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [32];
  Primitive PVar9;
  Geometry *pGVar10;
  code *pcVar11;
  RTCFilterFunctionN p_Var12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  long lVar20;
  long lVar21;
  ulong uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  long lVar69;
  undefined1 auVar70 [32];
  undefined8 uVar71;
  undefined8 uVar72;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [28];
  bool bVar78;
  int iVar79;
  uint uVar80;
  ulong uVar81;
  uint uVar82;
  ulong uVar83;
  byte bVar84;
  long lVar85;
  ulong uVar86;
  bool bVar87;
  undefined4 uVar88;
  undefined8 uVar89;
  float fVar108;
  vint4 bi_2;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar96 [16];
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  float fVar107;
  float fVar109;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined8 uVar113;
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar126;
  undefined1 auVar125 [64];
  undefined1 extraout_var [56];
  float fVar127;
  float fVar128;
  undefined1 auVar129 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  float fVar141;
  float fVar148;
  vint4 ai_2;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar147 [64];
  vint4 ai;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  vint4 bi;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [64];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  vint4 ai_1;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar205 [32];
  undefined1 auVar182 [32];
  float fVar183;
  float fVar190;
  float fVar191;
  undefined1 auVar184 [16];
  float fVar193;
  float fVar194;
  float fVar195;
  undefined1 auVar185 [32];
  float fVar192;
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [64];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar209;
  undefined1 auVar204 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  undefined1 auVar210 [32];
  float fVar216;
  float fVar217;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar219;
  undefined1 auVar213 [32];
  float fVar218;
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  undefined1 local_920 [32];
  ulong local_8c0;
  undefined4 local_800;
  RTCFilterFunctionNArguments local_750;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined4 local_5e0;
  undefined4 uStack_5dc;
  undefined4 uStack_5d8;
  undefined4 uStack_5d4;
  undefined4 uStack_5d0;
  undefined4 uStack_5cc;
  undefined4 uStack_5c8;
  undefined4 uStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 auStack_550 [16];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  int local_3e0;
  int local_3dc;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined1 local_380 [32];
  float local_360 [4];
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar163 [32];
  
  PVar9 = prim[1];
  uVar81 = (ulong)(byte)PVar9;
  lVar69 = uVar81 * 0x19;
  auVar155 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar155 = vinsertps_avx(auVar155,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar128 = *(float *)(prim + lVar69 + 0x12);
  auVar155 = vsubps_avx(auVar155,*(undefined1 (*) [16])(prim + lVar69 + 6));
  auVar90._0_4_ = fVar128 * auVar155._0_4_;
  auVar90._4_4_ = fVar128 * auVar155._4_4_;
  auVar90._8_4_ = fVar128 * auVar155._8_4_;
  auVar90._12_4_ = fVar128 * auVar155._12_4_;
  auVar160._0_4_ = fVar128 * auVar13._0_4_;
  auVar160._4_4_ = fVar128 * auVar13._4_4_;
  auVar160._8_4_ = fVar128 * auVar13._8_4_;
  auVar160._12_4_ = fVar128 * auVar13._12_4_;
  auVar155 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 4 + 6)));
  auVar155 = vcvtdq2ps_avx(auVar155);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 5 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar152 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 6 + 6)));
  auVar152 = vcvtdq2ps_avx(auVar152);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xb + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar9 * 0xc) + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar9 * 0xc + uVar81 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  uVar86 = (ulong)(uint)((int)(uVar81 * 9) * 2);
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 + 6)));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 + uVar81 + 6)));
  auVar92 = vcvtdq2ps_avx(auVar92);
  uVar86 = (ulong)(uint)((int)(uVar81 * 5) << 2);
  auVar129 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 + 6)));
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar211._4_4_ = auVar160._0_4_;
  auVar211._0_4_ = auVar160._0_4_;
  auVar211._8_4_ = auVar160._0_4_;
  auVar211._12_4_ = auVar160._0_4_;
  auVar115 = vshufps_avx(auVar160,auVar160,0x55);
  auVar91 = vshufps_avx(auVar160,auVar160,0xaa);
  fVar128 = auVar91._0_4_;
  auVar199._0_4_ = fVar128 * auVar152._0_4_;
  fVar127 = auVar91._4_4_;
  auVar199._4_4_ = fVar127 * auVar152._4_4_;
  fVar107 = auVar91._8_4_;
  auVar199._8_4_ = fVar107 * auVar152._8_4_;
  fVar108 = auVar91._12_4_;
  auVar199._12_4_ = fVar108 * auVar152._12_4_;
  auVar196._0_4_ = auVar17._0_4_ * fVar128;
  auVar196._4_4_ = auVar17._4_4_ * fVar127;
  auVar196._8_4_ = auVar17._8_4_ * fVar107;
  auVar196._12_4_ = auVar17._12_4_ * fVar108;
  auVar178._0_4_ = auVar129._0_4_ * fVar128;
  auVar178._4_4_ = auVar129._4_4_ * fVar127;
  auVar178._8_4_ = auVar129._8_4_ * fVar107;
  auVar178._12_4_ = auVar129._12_4_ * fVar108;
  auVar91 = vfmadd231ps_fma(auVar199,auVar115,auVar13);
  auVar116 = vfmadd231ps_fma(auVar196,auVar115,auVar16);
  auVar115 = vfmadd231ps_fma(auVar178,auVar92,auVar115);
  auVar142 = vfmadd231ps_fma(auVar91,auVar211,auVar155);
  auVar116 = vfmadd231ps_fma(auVar116,auVar211,auVar15);
  auVar150 = vfmadd231ps_fma(auVar115,auVar93,auVar211);
  auVar212._4_4_ = auVar90._0_4_;
  auVar212._0_4_ = auVar90._0_4_;
  auVar212._8_4_ = auVar90._0_4_;
  auVar212._12_4_ = auVar90._0_4_;
  auVar115 = vshufps_avx(auVar90,auVar90,0x55);
  auVar91 = vshufps_avx(auVar90,auVar90,0xaa);
  fVar128 = auVar91._0_4_;
  auVar161._0_4_ = fVar128 * auVar152._0_4_;
  fVar127 = auVar91._4_4_;
  auVar161._4_4_ = fVar127 * auVar152._4_4_;
  fVar107 = auVar91._8_4_;
  auVar161._8_4_ = fVar107 * auVar152._8_4_;
  fVar108 = auVar91._12_4_;
  auVar161._12_4_ = fVar108 * auVar152._12_4_;
  auVar114._0_4_ = auVar17._0_4_ * fVar128;
  auVar114._4_4_ = auVar17._4_4_ * fVar127;
  auVar114._8_4_ = auVar17._8_4_ * fVar107;
  auVar114._12_4_ = auVar17._12_4_ * fVar108;
  auVar91._0_4_ = auVar129._0_4_ * fVar128;
  auVar91._4_4_ = auVar129._4_4_ * fVar127;
  auVar91._8_4_ = auVar129._8_4_ * fVar107;
  auVar91._12_4_ = auVar129._12_4_ * fVar108;
  auVar13 = vfmadd231ps_fma(auVar161,auVar115,auVar13);
  auVar152 = vfmadd231ps_fma(auVar114,auVar115,auVar16);
  auVar16 = vfmadd231ps_fma(auVar91,auVar115,auVar92);
  auVar17 = vfmadd231ps_fma(auVar13,auVar212,auVar155);
  auVar92 = vfmadd231ps_fma(auVar152,auVar212,auVar15);
  auVar129 = vfmadd231ps_fma(auVar16,auVar212,auVar93);
  local_450._8_4_ = 0x7fffffff;
  local_450._0_8_ = 0x7fffffff7fffffff;
  local_450._12_4_ = 0x7fffffff;
  auVar155 = vandps_avx(auVar142,local_450);
  auVar149._8_4_ = 0x219392ef;
  auVar149._0_8_ = 0x219392ef219392ef;
  auVar149._12_4_ = 0x219392ef;
  auVar155 = vcmpps_avx(auVar155,auVar149,1);
  auVar13 = vblendvps_avx(auVar142,auVar149,auVar155);
  auVar155 = vandps_avx(auVar116,local_450);
  auVar155 = vcmpps_avx(auVar155,auVar149,1);
  auVar152 = vblendvps_avx(auVar116,auVar149,auVar155);
  auVar155 = vandps_avx(auVar150,local_450);
  auVar155 = vcmpps_avx(auVar155,auVar149,1);
  auVar155 = vblendvps_avx(auVar150,auVar149,auVar155);
  auVar15 = vrcpps_avx(auVar13);
  auVar174._8_4_ = 0x3f800000;
  auVar174._0_8_ = &DAT_3f8000003f800000;
  auVar174._12_4_ = 0x3f800000;
  auVar13 = vfnmadd213ps_fma(auVar13,auVar15,auVar174);
  auVar15 = vfmadd132ps_fma(auVar13,auVar15,auVar15);
  auVar13 = vrcpps_avx(auVar152);
  auVar152 = vfnmadd213ps_fma(auVar152,auVar13,auVar174);
  auVar16 = vfmadd132ps_fma(auVar152,auVar13,auVar13);
  auVar13 = vrcpps_avx(auVar155);
  auVar152 = vfnmadd213ps_fma(auVar155,auVar13,auVar174);
  auVar155._8_8_ = 0;
  auVar155._0_8_ = *(ulong *)(prim + uVar81 * 7 + 6);
  auVar155 = vpmovsxwd_avx(auVar155);
  auVar93 = vfmadd132ps_fma(auVar152,auVar13,auVar13);
  auVar155 = vcvtdq2ps_avx(auVar155);
  auVar155 = vsubps_avx(auVar155,auVar17);
  auVar150._0_4_ = auVar15._0_4_ * auVar155._0_4_;
  auVar150._4_4_ = auVar15._4_4_ * auVar155._4_4_;
  auVar150._8_4_ = auVar15._8_4_ * auVar155._8_4_;
  auVar150._12_4_ = auVar15._12_4_ * auVar155._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar81 * 9 + 6);
  auVar155 = vpmovsxwd_avx(auVar13);
  auVar155 = vcvtdq2ps_avx(auVar155);
  auVar155 = vsubps_avx(auVar155,auVar17);
  auVar162._0_4_ = auVar15._0_4_ * auVar155._0_4_;
  auVar162._4_4_ = auVar15._4_4_ * auVar155._4_4_;
  auVar162._8_4_ = auVar15._8_4_ * auVar155._8_4_;
  auVar162._12_4_ = auVar15._12_4_ * auVar155._12_4_;
  auVar116._1_3_ = 0;
  auVar116[0] = PVar9;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + 6);
  auVar13 = vpmovsxwd_avx(auVar152);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + uVar81 * -2 + 6);
  auVar155 = vpmovsxwd_avx(auVar15);
  auVar155 = vcvtdq2ps_avx(auVar155);
  auVar155 = vsubps_avx(auVar155,auVar92);
  auVar179._0_4_ = auVar155._0_4_ * auVar16._0_4_;
  auVar179._4_4_ = auVar155._4_4_ * auVar16._4_4_;
  auVar179._8_4_ = auVar155._8_4_ * auVar16._8_4_;
  auVar179._12_4_ = auVar155._12_4_ * auVar16._12_4_;
  auVar155 = vcvtdq2ps_avx(auVar13);
  auVar155 = vsubps_avx(auVar155,auVar92);
  auVar115._0_4_ = auVar16._0_4_ * auVar155._0_4_;
  auVar115._4_4_ = auVar16._4_4_ * auVar155._4_4_;
  auVar115._8_4_ = auVar16._8_4_ * auVar155._8_4_;
  auVar115._12_4_ = auVar16._12_4_ * auVar155._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar86 + uVar81 + 6);
  auVar155 = vpmovsxwd_avx(auVar16);
  auVar155 = vcvtdq2ps_avx(auVar155);
  auVar155 = vsubps_avx(auVar155,auVar129);
  auVar142._0_4_ = auVar93._0_4_ * auVar155._0_4_;
  auVar142._4_4_ = auVar93._4_4_ * auVar155._4_4_;
  auVar142._8_4_ = auVar93._8_4_ * auVar155._8_4_;
  auVar142._12_4_ = auVar93._12_4_ * auVar155._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar81 * 0x17 + 6);
  auVar155 = vpmovsxwd_avx(auVar17);
  auVar155 = vcvtdq2ps_avx(auVar155);
  auVar155 = vsubps_avx(auVar155,auVar129);
  auVar92._0_4_ = auVar93._0_4_ * auVar155._0_4_;
  auVar92._4_4_ = auVar93._4_4_ * auVar155._4_4_;
  auVar92._8_4_ = auVar93._8_4_ * auVar155._8_4_;
  auVar92._12_4_ = auVar93._12_4_ * auVar155._12_4_;
  auVar155 = vpminsd_avx(auVar150,auVar162);
  auVar13 = vpminsd_avx(auVar179,auVar115);
  auVar155 = vmaxps_avx(auVar155,auVar13);
  auVar13 = vpminsd_avx(auVar142,auVar92);
  uVar88 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar184._4_4_ = uVar88;
  auVar184._0_4_ = uVar88;
  auVar184._8_4_ = uVar88;
  auVar184._12_4_ = uVar88;
  auVar13 = vmaxps_avx(auVar13,auVar184);
  auVar155 = vmaxps_avx(auVar155,auVar13);
  local_460._0_4_ = auVar155._0_4_ * 0.99999964;
  local_460._4_4_ = auVar155._4_4_ * 0.99999964;
  local_460._8_4_ = auVar155._8_4_ * 0.99999964;
  local_460._12_4_ = auVar155._12_4_ * 0.99999964;
  auVar155 = vpmaxsd_avx(auVar150,auVar162);
  auVar13 = vpmaxsd_avx(auVar179,auVar115);
  auVar155 = vminps_avx(auVar155,auVar13);
  auVar13 = vpmaxsd_avx(auVar142,auVar92);
  uVar88 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar129._4_4_ = uVar88;
  auVar129._0_4_ = uVar88;
  auVar129._8_4_ = uVar88;
  auVar129._12_4_ = uVar88;
  auVar13 = vminps_avx(auVar13,auVar129);
  auVar155 = vminps_avx(auVar155,auVar13);
  auVar93._0_4_ = auVar155._0_4_ * 1.0000004;
  auVar93._4_4_ = auVar155._4_4_ * 1.0000004;
  auVar93._8_4_ = auVar155._8_4_ * 1.0000004;
  auVar93._12_4_ = auVar155._12_4_ * 1.0000004;
  auVar116[4] = PVar9;
  auVar116._5_3_ = 0;
  auVar116[8] = PVar9;
  auVar116._9_3_ = 0;
  auVar116[0xc] = PVar9;
  auVar116._13_3_ = 0;
  auVar13 = vpcmpgtd_avx(auVar116,_DAT_01ff0cf0);
  auVar155 = vcmpps_avx(local_460,auVar93,2);
  auVar155 = vandps_avx(auVar155,auVar13);
  uVar82 = vmovmskps_avx(auVar155);
  bVar87 = uVar82 != 0;
  if (bVar87) {
    uVar82 = uVar82 & 0xff;
    local_600 = mm_lookupmask_ps._16_8_;
    uStack_5f8 = mm_lookupmask_ps._24_8_;
    uStack_5f0 = mm_lookupmask_ps._16_8_;
    uStack_5e8 = mm_lookupmask_ps._24_8_;
    iVar79 = 1 << ((uint)k & 0x1f);
    auVar97._4_4_ = iVar79;
    auVar97._0_4_ = iVar79;
    auVar97._8_4_ = iVar79;
    auVar97._12_4_ = iVar79;
    auVar97._16_4_ = iVar79;
    auVar97._20_4_ = iVar79;
    auVar97._24_4_ = iVar79;
    auVar97._28_4_ = iVar79;
    auVar105 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar97 = vpand_avx2(auVar97,auVar105);
    local_2c0 = vpcmpeqd_avx2(auVar97,auVar105);
    do {
      auVar97 = local_5a0;
      lVar20 = 0;
      uVar86 = (ulong)uVar82;
      for (uVar81 = uVar86; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
        lVar20 = lVar20 + 1;
      }
      uVar86 = uVar86 - 1 & uVar86;
      local_680._4_4_ = *(undefined4 *)(prim + lVar20 * 4 + 6);
      local_5c0._0_4_ = local_680._4_4_;
      uVar81 = (ulong)(uint)((int)lVar20 << 6);
      uVar82 = *(uint *)(prim + 2);
      pGVar10 = (context->scene->geometries).items[uVar82].ptr;
      pPVar1 = prim + uVar81 + lVar69 + 0x16;
      uVar71 = *(undefined8 *)pPVar1;
      uVar72 = *(undefined8 *)(pPVar1 + 8);
      auVar13 = *(undefined1 (*) [16])pPVar1;
      auVar155 = *(undefined1 (*) [16])pPVar1;
      if (uVar86 != 0) {
        uVar83 = uVar86 - 1 & uVar86;
        for (uVar22 = uVar86; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
        }
        if (uVar83 != 0) {
          for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_610 = *(undefined1 (*) [16])(prim + uVar81 + lVar69 + 0x26);
      local_620 = *(undefined1 (*) [16])(prim + uVar81 + lVar69 + 0x36);
      local_630 = *(undefined1 (*) [16])(prim + uVar81 + lVar69 + 0x46);
      iVar79 = (int)pGVar10[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar152 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar17 = vinsertps_avx(auVar152,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar15 = vsubps_avx(*(undefined1 (*) [16])pPVar1,auVar17);
      uVar88 = auVar15._0_4_;
      auVar151._4_4_ = uVar88;
      auVar151._0_4_ = uVar88;
      auVar151._8_4_ = uVar88;
      auVar151._12_4_ = uVar88;
      auVar152 = vshufps_avx(auVar15,auVar15,0x55);
      auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
      aVar6 = pre->ray_space[k].vx.field_0;
      aVar7 = pre->ray_space[k].vy.field_0;
      fVar128 = pre->ray_space[k].vz.field_0.m128[0];
      fVar127 = pre->ray_space[k].vz.field_0.m128[1];
      fVar107 = pre->ray_space[k].vz.field_0.m128[2];
      fVar108 = pre->ray_space[k].vz.field_0.m128[3];
      auVar168._0_4_ = fVar128 * auVar15._0_4_;
      auVar168._4_4_ = fVar127 * auVar15._4_4_;
      auVar168._8_4_ = fVar107 * auVar15._8_4_;
      auVar168._12_4_ = fVar108 * auVar15._12_4_;
      auVar152 = vfmadd231ps_fma(auVar168,(undefined1  [16])aVar7,auVar152);
      auVar92 = vfmadd231ps_fma(auVar152,(undefined1  [16])aVar6,auVar151);
      auVar152 = vblendps_avx(auVar92,*(undefined1 (*) [16])pPVar1,8);
      auVar16 = vsubps_avx(local_610,auVar17);
      uVar88 = auVar16._0_4_;
      auVar169._4_4_ = uVar88;
      auVar169._0_4_ = uVar88;
      auVar169._8_4_ = uVar88;
      auVar169._12_4_ = uVar88;
      auVar15 = vshufps_avx(auVar16,auVar16,0x55);
      auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
      auVar197._0_4_ = fVar128 * auVar16._0_4_;
      auVar197._4_4_ = fVar127 * auVar16._4_4_;
      auVar197._8_4_ = fVar107 * auVar16._8_4_;
      auVar197._12_4_ = fVar108 * auVar16._12_4_;
      auVar15 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar7,auVar15);
      auVar129 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar6,auVar169);
      auVar15 = vblendps_avx(auVar129,local_610,8);
      auVar93 = vsubps_avx(local_620,auVar17);
      uVar88 = auVar93._0_4_;
      auVar175._4_4_ = uVar88;
      auVar175._0_4_ = uVar88;
      auVar175._8_4_ = uVar88;
      auVar175._12_4_ = uVar88;
      auVar16 = vshufps_avx(auVar93,auVar93,0x55);
      auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
      auVar200._0_4_ = fVar128 * auVar93._0_4_;
      auVar200._4_4_ = fVar127 * auVar93._4_4_;
      auVar200._8_4_ = fVar107 * auVar93._8_4_;
      auVar200._12_4_ = fVar108 * auVar93._12_4_;
      auVar16 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar7,auVar16);
      auVar115 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar6,auVar175);
      auVar16 = vblendps_avx(auVar115,local_620,8);
      auVar93 = vsubps_avx(local_630,auVar17);
      uVar88 = auVar93._0_4_;
      auVar176._4_4_ = uVar88;
      auVar176._0_4_ = uVar88;
      auVar176._8_4_ = uVar88;
      auVar176._12_4_ = uVar88;
      auVar17 = vshufps_avx(auVar93,auVar93,0x55);
      auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
      auVar204._0_4_ = fVar128 * auVar93._0_4_;
      auVar204._4_4_ = fVar127 * auVar93._4_4_;
      auVar204._8_4_ = fVar107 * auVar93._8_4_;
      auVar204._12_4_ = fVar108 * auVar93._12_4_;
      auVar17 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar7,auVar17);
      auVar91 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar6,auVar176);
      auVar17 = vblendps_avx(auVar91,local_630,8);
      auVar152 = vandps_avx(auVar152,local_450);
      auVar15 = vandps_avx(auVar15,local_450);
      auVar93 = vmaxps_avx(auVar152,auVar15);
      auVar152 = vandps_avx(auVar16,local_450);
      auVar15 = vandps_avx(auVar17,local_450);
      auVar152 = vmaxps_avx(auVar152,auVar15);
      auVar152 = vmaxps_avx(auVar93,auVar152);
      auVar15 = vmovshdup_avx(auVar152);
      auVar15 = vmaxss_avx(auVar15,auVar152);
      auVar152 = vshufpd_avx(auVar152,auVar152,1);
      auVar152 = vmaxss_avx(auVar152,auVar15);
      lVar20 = (long)iVar79 * 0x44;
      auVar15 = vmovshdup_avx(auVar92);
      uVar89 = auVar15._0_8_;
      local_580._8_8_ = uVar89;
      local_580._0_8_ = uVar89;
      local_580._16_8_ = uVar89;
      local_580._24_8_ = uVar89;
      auVar15 = vmovshdup_avx(auVar129);
      uVar89 = auVar15._0_8_;
      local_500._8_8_ = uVar89;
      local_500._0_8_ = uVar89;
      local_500._16_8_ = uVar89;
      local_500._24_8_ = uVar89;
      auVar105 = *(undefined1 (*) [32])(bspline_basis0 + lVar20 + 0x908);
      uVar88 = auVar115._0_4_;
      local_6a0._4_4_ = uVar88;
      local_6a0._0_4_ = uVar88;
      local_6a0._8_4_ = uVar88;
      local_6a0._12_4_ = uVar88;
      local_6a0._16_4_ = uVar88;
      local_6a0._20_4_ = uVar88;
      local_6a0._24_4_ = uVar88;
      local_6a0._28_4_ = uVar88;
      auVar15 = vmovshdup_avx(auVar115);
      uVar89 = auVar15._0_8_;
      auVar201._8_8_ = uVar89;
      auVar201._0_8_ = uVar89;
      auVar201._16_8_ = uVar89;
      auVar201._24_8_ = uVar89;
      fVar128 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar20 + 0xd8c);
      auVar77 = *(undefined1 (*) [28])(bspline_basis0 + lVar20 + 0xd8c);
      local_6e0 = auVar91._0_4_;
      auVar15 = vmovshdup_avx(auVar91);
      uVar89 = auVar15._0_8_;
      auVar104._4_4_ = local_6e0 * *(float *)(bspline_basis0 + lVar20 + 0xd90);
      auVar104._0_4_ = local_6e0 * fVar128;
      auVar104._8_4_ = local_6e0 * *(float *)(bspline_basis0 + lVar20 + 0xd94);
      auVar104._12_4_ = local_6e0 * *(float *)(bspline_basis0 + lVar20 + 0xd98);
      auVar104._16_4_ = local_6e0 * *(float *)(bspline_basis0 + lVar20 + 0xd9c);
      auVar104._20_4_ = local_6e0 * *(float *)(bspline_basis0 + lVar20 + 0xda0);
      auVar104._24_4_ = local_6e0 * *(float *)(bspline_basis0 + lVar20 + 0xda4);
      auVar104._28_4_ = *(undefined4 *)(bspline_basis0 + lVar20 + 0xda8);
      auVar16 = vfmadd231ps_fma(auVar104,auVar105,local_6a0);
      fVar141 = auVar15._0_4_;
      auVar122._0_4_ = fVar141 * fVar128;
      fVar148 = auVar15._4_4_;
      auVar122._4_4_ = fVar148 * *(float *)(bspline_basis0 + lVar20 + 0xd90);
      auVar122._8_4_ = fVar141 * *(float *)(bspline_basis0 + lVar20 + 0xd94);
      auVar122._12_4_ = fVar148 * *(float *)(bspline_basis0 + lVar20 + 0xd98);
      auVar122._16_4_ = fVar141 * *(float *)(bspline_basis0 + lVar20 + 0xd9c);
      auVar122._20_4_ = fVar148 * *(float *)(bspline_basis0 + lVar20 + 0xda0);
      auVar122._24_4_ = fVar141 * *(float *)(bspline_basis0 + lVar20 + 0xda4);
      auVar122._28_4_ = 0;
      auVar15 = vfmadd231ps_fma(auVar122,auVar105,auVar201);
      auVar104 = *(undefined1 (*) [32])(bspline_basis0 + lVar20 + 0x484);
      uVar88 = auVar129._0_4_;
      auVar213._4_4_ = uVar88;
      auVar213._0_4_ = uVar88;
      auVar213._8_4_ = uVar88;
      auVar213._12_4_ = uVar88;
      auVar213._16_4_ = uVar88;
      auVar213._20_4_ = uVar88;
      auVar213._24_4_ = uVar88;
      auVar213._28_4_ = uVar88;
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar104,auVar213);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar104,local_500);
      auVar122 = *(undefined1 (*) [32])(bspline_basis0 + lVar20);
      local_800 = auVar92._0_4_;
      auVar185._4_4_ = local_800;
      auVar185._0_4_ = local_800;
      auVar185._8_4_ = local_800;
      auVar185._12_4_ = local_800;
      auVar185._16_4_ = local_800;
      auVar185._20_4_ = local_800;
      auVar185._24_4_ = local_800;
      auVar185._28_4_ = local_800;
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar122,auVar185);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar122,local_580);
      auVar205 = *(undefined1 (*) [32])(bspline_basis1 + lVar20 + 0x908);
      fVar127 = *(float *)(bspline_basis1 + lVar20 + 0xd8c);
      fVar107 = *(float *)(bspline_basis1 + lVar20 + 0xd90);
      fVar108 = *(float *)(bspline_basis1 + lVar20 + 0xd94);
      fVar109 = *(float *)(bspline_basis1 + lVar20 + 0xd98);
      fVar110 = *(float *)(bspline_basis1 + lVar20 + 0xd9c);
      fVar111 = *(float *)(bspline_basis1 + lVar20 + 0xda0);
      fVar112 = *(float *)(bspline_basis1 + lVar20 + 0xda4);
      auVar8._4_4_ = local_6e0 * fVar107;
      auVar8._0_4_ = local_6e0 * fVar127;
      auVar8._8_4_ = local_6e0 * fVar108;
      auVar8._12_4_ = local_6e0 * fVar109;
      auVar8._16_4_ = local_6e0 * fVar110;
      auVar8._20_4_ = local_6e0 * fVar111;
      auVar8._24_4_ = local_6e0 * fVar112;
      auVar8._28_4_ = *(undefined4 *)(bspline_basis0 + lVar20 + 0xda8);
      auVar17 = vfmadd231ps_fma(auVar8,auVar205,local_6a0);
      auVar181._4_4_ = fVar148 * fVar107;
      auVar181._0_4_ = fVar141 * fVar127;
      auVar181._8_4_ = fVar141 * fVar108;
      auVar181._12_4_ = fVar148 * fVar109;
      auVar181._16_4_ = fVar141 * fVar110;
      auVar181._20_4_ = fVar148 * fVar111;
      auVar181._24_4_ = fVar141 * fVar112;
      auVar181._28_4_ = local_6e0;
      auVar93 = vfmadd231ps_fma(auVar181,auVar205,auVar201);
      auVar8 = *(undefined1 (*) [32])(bspline_basis1 + lVar20 + 0x484);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar8,auVar213);
      auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar8,local_500);
      auVar181 = *(undefined1 (*) [32])(bspline_basis1 + lVar20);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar181,auVar185);
      auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar181,local_580);
      auVar98 = ZEXT1632(auVar17);
      auVar117 = ZEXT1632(auVar16);
      auVar106 = vsubps_avx(auVar98,auVar117);
      auVar134 = ZEXT1632(auVar93);
      auVar210 = ZEXT1632(auVar15);
      _local_480 = vsubps_avx(auVar134,auVar210);
      auVar99._0_4_ = auVar15._0_4_ * auVar106._0_4_;
      auVar99._4_4_ = auVar15._4_4_ * auVar106._4_4_;
      auVar99._8_4_ = auVar15._8_4_ * auVar106._8_4_;
      auVar99._12_4_ = auVar15._12_4_ * auVar106._12_4_;
      auVar99._16_4_ = auVar106._16_4_ * 0.0;
      auVar99._20_4_ = auVar106._20_4_ * 0.0;
      auVar99._24_4_ = auVar106._24_4_ * 0.0;
      auVar99._28_4_ = 0;
      fVar209 = local_480._0_4_;
      auVar118._0_4_ = fVar209 * auVar16._0_4_;
      fVar216 = local_480._4_4_;
      auVar118._4_4_ = fVar216 * auVar16._4_4_;
      fVar217 = local_480._8_4_;
      auVar118._8_4_ = fVar217 * auVar16._8_4_;
      fVar218 = local_480._12_4_;
      auVar118._12_4_ = fVar218 * auVar16._12_4_;
      fVar219 = local_480._16_4_;
      auVar118._16_4_ = fVar219 * 0.0;
      fVar183 = local_480._20_4_;
      auVar118._20_4_ = fVar183 * 0.0;
      fVar190 = local_480._24_4_;
      auVar118._24_4_ = fVar190 * 0.0;
      auVar118._28_4_ = 0;
      auVar99 = vsubps_avx(auVar99,auVar118);
      auVar15 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
      uVar113 = auVar15._0_8_;
      local_80._8_8_ = uVar113;
      local_80._0_8_ = uVar113;
      local_80._16_8_ = uVar113;
      local_80._24_8_ = uVar113;
      auVar16 = vpermilps_avx(local_610,0xff);
      uVar113 = auVar16._0_8_;
      local_a0._8_8_ = uVar113;
      local_a0._0_8_ = uVar113;
      local_a0._16_8_ = uVar113;
      local_a0._24_8_ = uVar113;
      auVar16 = vpermilps_avx(local_620,0xff);
      uVar113 = auVar16._0_8_;
      local_c0._8_8_ = uVar113;
      local_c0._0_8_ = uVar113;
      local_c0._16_8_ = uVar113;
      local_c0._24_8_ = uVar113;
      auVar16 = vpermilps_avx(local_630,0xff);
      local_e0 = auVar16._0_8_;
      local_700._0_4_ = auVar77._0_4_;
      local_700._4_4_ = auVar77._4_4_;
      fStack_6f8 = auVar77._8_4_;
      fStack_6f4 = auVar77._12_4_;
      fStack_6f0 = auVar77._16_4_;
      fStack_6ec = auVar77._20_4_;
      fStack_6e8 = auVar77._24_4_;
      fVar128 = auVar16._0_4_;
      fVar126 = auVar16._4_4_;
      auVar14._4_4_ = fVar126 * (float)local_700._4_4_;
      auVar14._0_4_ = fVar128 * (float)local_700._0_4_;
      auVar14._8_4_ = fVar128 * fStack_6f8;
      auVar14._12_4_ = fVar126 * fStack_6f4;
      auVar14._16_4_ = fVar128 * fStack_6f0;
      auVar14._20_4_ = fVar126 * fStack_6ec;
      auVar14._24_4_ = fVar128 * fStack_6e8;
      auVar14._28_4_ = auVar205._28_4_;
      auVar16 = vfmadd231ps_fma(auVar14,local_c0,auVar105);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar104,local_a0);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar122,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar19._4_4_ = fVar126 * fVar107;
      auVar19._0_4_ = fVar128 * fVar127;
      auVar19._8_4_ = fVar128 * fVar108;
      auVar19._12_4_ = fVar126 * fVar109;
      auVar19._16_4_ = fVar128 * fVar110;
      auVar19._20_4_ = fVar126 * fVar111;
      auVar19._24_4_ = fVar128 * fVar112;
      auVar19._28_4_ = auVar122._28_4_;
      auVar16 = vfmadd231ps_fma(auVar19,auVar205,local_c0);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar8,local_a0);
      auVar93 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar181,local_80);
      auVar138._4_4_ = fVar216 * fVar216;
      auVar138._0_4_ = fVar209 * fVar209;
      auVar138._8_4_ = fVar217 * fVar217;
      auVar138._12_4_ = fVar218 * fVar218;
      auVar138._16_4_ = fVar219 * fVar219;
      auVar138._20_4_ = fVar183 * fVar183;
      auVar138._24_4_ = fVar190 * fVar190;
      auVar138._28_4_ = auVar15._4_4_;
      auVar15 = vfmadd231ps_fma(auVar138,auVar106,auVar106);
      auVar14 = vmaxps_avx(ZEXT1632(auVar17),ZEXT1632(auVar93));
      auVar170._4_4_ = auVar14._4_4_ * auVar14._4_4_ * auVar15._4_4_;
      auVar170._0_4_ = auVar14._0_4_ * auVar14._0_4_ * auVar15._0_4_;
      auVar170._8_4_ = auVar14._8_4_ * auVar14._8_4_ * auVar15._8_4_;
      auVar170._12_4_ = auVar14._12_4_ * auVar14._12_4_ * auVar15._12_4_;
      auVar170._16_4_ = auVar14._16_4_ * auVar14._16_4_ * 0.0;
      auVar170._20_4_ = auVar14._20_4_ * auVar14._20_4_ * 0.0;
      auVar170._24_4_ = auVar14._24_4_ * auVar14._24_4_ * 0.0;
      auVar170._28_4_ = auVar14._28_4_;
      auVar18._4_4_ = auVar99._4_4_ * auVar99._4_4_;
      auVar18._0_4_ = auVar99._0_4_ * auVar99._0_4_;
      auVar18._8_4_ = auVar99._8_4_ * auVar99._8_4_;
      auVar18._12_4_ = auVar99._12_4_ * auVar99._12_4_;
      auVar18._16_4_ = auVar99._16_4_ * auVar99._16_4_;
      auVar18._20_4_ = auVar99._20_4_ * auVar99._20_4_;
      auVar18._24_4_ = auVar99._24_4_ * auVar99._24_4_;
      auVar18._28_4_ = auVar99._28_4_;
      auVar14 = vcmpps_avx(auVar18,auVar170,2);
      fVar128 = auVar152._0_4_ * 4.7683716e-07;
      auVar100._0_4_ = (float)iVar79;
      local_5a0._4_12_ = auVar91._4_12_;
      local_5a0._0_4_ = auVar100._0_4_;
      local_5a0._16_16_ = auVar97._16_16_;
      auVar100._4_4_ = auVar100._0_4_;
      auVar100._8_4_ = auVar100._0_4_;
      auVar100._12_4_ = auVar100._0_4_;
      auVar100._16_4_ = auVar100._0_4_;
      auVar100._20_4_ = auVar100._0_4_;
      auVar100._24_4_ = auVar100._0_4_;
      auVar100._28_4_ = auVar100._0_4_;
      auVar97 = vcmpps_avx(_DAT_02020f40,auVar100,1);
      auVar15 = vpermilps_avx(auVar92,0xaa);
      uVar113 = auVar15._0_8_;
      auVar143._8_8_ = uVar113;
      auVar143._0_8_ = uVar113;
      auVar143._16_8_ = uVar113;
      auVar143._24_8_ = uVar113;
      auVar152 = vpermilps_avx(auVar129,0xaa);
      uVar113 = auVar152._0_8_;
      local_4e0._8_8_ = uVar113;
      local_4e0._0_8_ = uVar113;
      local_4e0._16_8_ = uVar113;
      local_4e0._24_8_ = uVar113;
      auVar16 = vpermilps_avx(auVar115,0xaa);
      uVar113 = auVar16._0_8_;
      auVar163._8_8_ = uVar113;
      auVar163._0_8_ = uVar113;
      auVar163._16_8_ = uVar113;
      auVar163._24_8_ = uVar113;
      auVar167 = ZEXT3264(auVar163);
      auVar152 = vshufps_avx(auVar91,auVar91,0xaa);
      uVar113 = auVar152._0_8_;
      register0x00001508 = uVar113;
      local_720 = uVar113;
      register0x00001510 = uVar113;
      register0x00001518 = uVar113;
      auVar207 = ZEXT3264(_local_720);
      auVar99 = auVar97 & auVar14;
      uVar88 = *(undefined4 *)(ray + k * 4 + 0x60);
      fStack_6dc = local_6e0;
      fStack_6d8 = local_6e0;
      fStack_6d4 = local_6e0;
      fStack_6d0 = local_6e0;
      fStack_6cc = local_6e0;
      fStack_6c8 = local_6e0;
      fStack_6c4 = local_6e0;
      if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar99 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar99 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar99 >> 0x7f,0) == '\0') &&
            (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar99 >> 0xbf,0) == '\0') &&
          (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar99[0x1f])
      {
        bVar78 = false;
        auVar189 = ZEXT3264(CONCAT428(local_6e0,
                                      CONCAT424(local_6e0,
                                                CONCAT420(local_6e0,
                                                          CONCAT416(local_6e0,
                                                                    CONCAT412(local_6e0,
                                                                              CONCAT48(local_6e0,
                                                                                       CONCAT44(
                                                  local_6e0,local_6e0))))))));
        auVar125 = ZEXT3264(CONCAT428(fVar148,CONCAT424(fVar141,CONCAT420(fVar148,CONCAT416(fVar141,
                                                  CONCAT412(fVar148,CONCAT48(fVar141,uVar89)))))));
      }
      else {
        local_5e0 = SUB84(pGVar10,0);
        uStack_5dc = (undefined4)((ulong)pGVar10 >> 0x20);
        auVar14 = vandps_avx(auVar14,auVar97);
        fVar126 = auVar152._0_4_;
        fVar209 = auVar152._4_4_;
        auVar158._4_4_ = fVar209 * fVar107;
        auVar158._0_4_ = fVar126 * fVar127;
        auVar158._8_4_ = fVar126 * fVar108;
        auVar158._12_4_ = fVar209 * fVar109;
        auVar158._16_4_ = fVar126 * fVar110;
        auVar158._20_4_ = fVar209 * fVar111;
        auVar158._24_4_ = fVar126 * fVar112;
        auVar158._28_4_ = auVar14._28_4_;
        auVar152 = vfmadd213ps_fma(auVar205,auVar163,auVar158);
        auVar152 = vfmadd213ps_fma(auVar8,local_4e0,ZEXT1632(auVar152));
        auVar152 = vfmadd213ps_fma(auVar181,auVar143,ZEXT1632(auVar152));
        auVar205._4_4_ = fVar209 * (float)local_700._4_4_;
        auVar205._0_4_ = fVar126 * (float)local_700._0_4_;
        auVar205._8_4_ = fVar126 * fStack_6f8;
        auVar205._12_4_ = fVar209 * fStack_6f4;
        auVar205._16_4_ = fVar126 * fStack_6f0;
        auVar205._20_4_ = fVar209 * fStack_6ec;
        auVar205._24_4_ = fVar126 * fStack_6e8;
        auVar205._28_4_ = auVar14._28_4_;
        auVar92 = vfmadd213ps_fma(auVar105,auVar163,auVar205);
        auVar92 = vfmadd213ps_fma(auVar104,local_4e0,ZEXT1632(auVar92));
        auVar97 = *(undefined1 (*) [32])(bspline_basis0 + lVar20 + 0x1210);
        auVar105 = *(undefined1 (*) [32])(bspline_basis0 + lVar20 + 0x1694);
        auVar104 = *(undefined1 (*) [32])(bspline_basis0 + lVar20 + 0x1b18);
        fVar127 = *(float *)(bspline_basis0 + lVar20 + 0x1f9c);
        fVar107 = *(float *)(bspline_basis0 + lVar20 + 0x1fa0);
        fVar108 = *(float *)(bspline_basis0 + lVar20 + 0x1fa4);
        fVar109 = *(float *)(bspline_basis0 + lVar20 + 0x1fa8);
        fVar110 = *(float *)(bspline_basis0 + lVar20 + 0x1fac);
        fVar111 = *(float *)(bspline_basis0 + lVar20 + 0x1fb0);
        fVar112 = *(float *)(bspline_basis0 + lVar20 + 0x1fb4);
        auVar177._4_4_ = local_6e0 * fVar107;
        auVar177._0_4_ = local_6e0 * fVar127;
        auVar177._8_4_ = local_6e0 * fVar108;
        auVar177._12_4_ = local_6e0 * fVar109;
        auVar177._16_4_ = local_6e0 * fVar110;
        auVar177._20_4_ = local_6e0 * fVar111;
        auVar177._24_4_ = local_6e0 * fVar112;
        auVar177._28_4_ = auVar16._4_4_;
        auVar180._0_4_ = fVar127 * fVar141;
        auVar180._4_4_ = fVar107 * fVar148;
        auVar180._8_4_ = fVar108 * fVar141;
        auVar180._12_4_ = fVar109 * fVar148;
        auVar180._16_4_ = fVar110 * fVar141;
        auVar180._20_4_ = fVar111 * fVar148;
        auVar180._24_4_ = fVar112 * fVar141;
        auVar180._28_4_ = 0;
        auVar198._0_4_ = fVar126 * fVar127;
        auVar198._4_4_ = fVar209 * fVar107;
        auVar198._8_4_ = fVar126 * fVar108;
        auVar198._12_4_ = fVar209 * fVar109;
        auVar198._16_4_ = fVar126 * fVar110;
        auVar198._20_4_ = fVar209 * fVar111;
        auVar198._24_4_ = fVar126 * fVar112;
        auVar198._28_4_ = 0;
        auVar16 = vfmadd231ps_fma(auVar177,auVar104,local_6a0);
        auVar129 = vfmadd231ps_fma(auVar180,auVar104,auVar201);
        auVar115 = vfmadd231ps_fma(auVar198,auVar163,auVar104);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar105,auVar213);
        auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),auVar105,local_500);
        auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),local_4e0,auVar105);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar97,auVar185);
        auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),auVar97,local_580);
        auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar97,auVar143);
        fVar127 = *(float *)(bspline_basis1 + lVar20 + 0x1f9c);
        fVar107 = *(float *)(bspline_basis1 + lVar20 + 0x1fa0);
        fVar108 = *(float *)(bspline_basis1 + lVar20 + 0x1fa4);
        fVar109 = *(float *)(bspline_basis1 + lVar20 + 0x1fa8);
        fVar110 = *(float *)(bspline_basis1 + lVar20 + 0x1fac);
        fVar111 = *(float *)(bspline_basis1 + lVar20 + 0x1fb0);
        fVar112 = *(float *)(bspline_basis1 + lVar20 + 0x1fb4);
        auVar202._0_4_ = local_6e0 * fVar127;
        auVar202._4_4_ = local_6e0 * fVar107;
        auVar202._8_4_ = local_6e0 * fVar108;
        auVar202._12_4_ = local_6e0 * fVar109;
        auVar202._16_4_ = local_6e0 * fVar110;
        auVar202._20_4_ = local_6e0 * fVar111;
        auVar202._24_4_ = local_6e0 * fVar112;
        auVar202._28_4_ = 0;
        auVar105._4_4_ = fVar148 * fVar107;
        auVar105._0_4_ = fVar141 * fVar127;
        auVar105._8_4_ = fVar141 * fVar108;
        auVar105._12_4_ = fVar148 * fVar109;
        auVar105._16_4_ = fVar141 * fVar110;
        auVar105._20_4_ = fVar148 * fVar111;
        auVar105._24_4_ = fVar141 * fVar112;
        auVar105._28_4_ = local_6e0;
        auVar23._4_4_ = fVar209 * fVar107;
        auVar23._0_4_ = fVar126 * fVar127;
        auVar23._8_4_ = fVar126 * fVar108;
        auVar23._12_4_ = fVar209 * fVar109;
        auVar23._16_4_ = fVar126 * fVar110;
        auVar23._20_4_ = fVar209 * fVar111;
        auVar23._24_4_ = fVar126 * fVar112;
        auVar23._28_4_ = fVar209;
        auVar97 = *(undefined1 (*) [32])(bspline_basis1 + lVar20 + 0x1b18);
        auVar91 = vfmadd231ps_fma(auVar202,auVar97,local_6a0);
        auVar116 = vfmadd231ps_fma(auVar105,auVar97,auVar201);
        auVar142 = vfmadd231ps_fma(auVar23,auVar163,auVar97);
        auVar97 = *(undefined1 (*) [32])(bspline_basis1 + lVar20 + 0x1694);
        auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar97,auVar213);
        auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar97,local_500);
        auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),local_4e0,auVar97);
        auVar97 = *(undefined1 (*) [32])(bspline_basis1 + lVar20 + 0x1210);
        auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar97,auVar185);
        auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar97,local_580);
        auVar119._8_4_ = 0x7fffffff;
        auVar119._0_8_ = 0x7fffffff7fffffff;
        auVar119._12_4_ = 0x7fffffff;
        auVar119._16_4_ = 0x7fffffff;
        auVar119._20_4_ = 0x7fffffff;
        auVar119._24_4_ = 0x7fffffff;
        auVar119._28_4_ = 0x7fffffff;
        auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),auVar143,auVar97);
        auVar97 = vandps_avx(ZEXT1632(auVar16),auVar119);
        auVar105 = vandps_avx(ZEXT1632(auVar129),auVar119);
        auVar105 = vmaxps_avx(auVar97,auVar105);
        auVar97 = vandps_avx(ZEXT1632(auVar115),auVar119);
        auVar97 = vmaxps_avx(auVar105,auVar97);
        auVar135._4_4_ = fVar128;
        auVar135._0_4_ = fVar128;
        auVar135._8_4_ = fVar128;
        auVar135._12_4_ = fVar128;
        auVar135._16_4_ = fVar128;
        auVar135._20_4_ = fVar128;
        auVar135._24_4_ = fVar128;
        auVar135._28_4_ = fVar128;
        auVar97 = vcmpps_avx(auVar97,auVar135,1);
        auVar104 = vblendvps_avx(ZEXT1632(auVar16),auVar106,auVar97);
        auVar205 = vblendvps_avx(ZEXT1632(auVar129),_local_480,auVar97);
        auVar97 = vandps_avx(ZEXT1632(auVar91),auVar119);
        auVar105 = vandps_avx(ZEXT1632(auVar116),auVar119);
        auVar8 = vmaxps_avx(auVar97,auVar105);
        auVar97 = vandps_avx(ZEXT1632(auVar142),auVar119);
        auVar97 = vmaxps_avx(auVar8,auVar97);
        auVar181 = vcmpps_avx(auVar97,auVar135,1);
        auVar97 = vblendvps_avx(ZEXT1632(auVar91),auVar106,auVar181);
        auVar8 = vblendvps_avx(ZEXT1632(auVar116),_local_480,auVar181);
        auVar16 = vfmadd213ps_fma(auVar122,auVar143,ZEXT1632(auVar92));
        auVar92 = vfmadd213ps_fma(auVar104,auVar104,ZEXT832(0) << 0x20);
        auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar205,auVar205);
        auVar122 = vrsqrtps_avx(ZEXT1632(auVar92));
        fVar127 = auVar122._0_4_;
        fVar107 = auVar122._4_4_;
        fVar108 = auVar122._8_4_;
        fVar109 = auVar122._12_4_;
        fVar110 = auVar122._16_4_;
        fVar111 = auVar122._20_4_;
        fVar112 = auVar122._24_4_;
        auVar24._4_4_ = fVar107 * fVar107 * fVar107 * auVar92._4_4_ * -0.5;
        auVar24._0_4_ = fVar127 * fVar127 * fVar127 * auVar92._0_4_ * -0.5;
        auVar24._8_4_ = fVar108 * fVar108 * fVar108 * auVar92._8_4_ * -0.5;
        auVar24._12_4_ = fVar109 * fVar109 * fVar109 * auVar92._12_4_ * -0.5;
        auVar24._16_4_ = fVar110 * fVar110 * fVar110 * -0.0;
        auVar24._20_4_ = fVar111 * fVar111 * fVar111 * -0.0;
        auVar24._24_4_ = fVar112 * fVar112 * fVar112 * -0.0;
        auVar24._28_4_ = 0;
        auVar214._8_4_ = 0x3fc00000;
        auVar214._0_8_ = 0x3fc000003fc00000;
        auVar214._12_4_ = 0x3fc00000;
        auVar214._16_4_ = 0x3fc00000;
        auVar214._20_4_ = 0x3fc00000;
        auVar214._24_4_ = 0x3fc00000;
        auVar214._28_4_ = 0x3fc00000;
        auVar92 = vfmadd231ps_fma(auVar24,auVar214,auVar122);
        fVar127 = auVar92._0_4_;
        fVar107 = auVar92._4_4_;
        auVar25._4_4_ = auVar205._4_4_ * fVar107;
        auVar25._0_4_ = auVar205._0_4_ * fVar127;
        fVar108 = auVar92._8_4_;
        auVar25._8_4_ = auVar205._8_4_ * fVar108;
        fVar109 = auVar92._12_4_;
        auVar25._12_4_ = auVar205._12_4_ * fVar109;
        auVar25._16_4_ = auVar205._16_4_ * 0.0;
        auVar25._20_4_ = auVar205._20_4_ * 0.0;
        auVar25._24_4_ = auVar205._24_4_ * 0.0;
        auVar25._28_4_ = auVar122._28_4_;
        auVar26._4_4_ = -auVar104._4_4_ * fVar107;
        auVar26._0_4_ = -auVar104._0_4_ * fVar127;
        auVar26._8_4_ = -auVar104._8_4_ * fVar108;
        auVar26._12_4_ = -auVar104._12_4_ * fVar109;
        auVar26._16_4_ = -auVar104._16_4_ * 0.0;
        auVar26._20_4_ = -auVar104._20_4_ * 0.0;
        auVar26._24_4_ = -auVar104._24_4_ * 0.0;
        auVar26._28_4_ = auVar105._28_4_;
        auVar92 = vfmadd213ps_fma(auVar97,auVar97,ZEXT832(0) << 0x20);
        auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar8,auVar8);
        auVar105 = vrsqrtps_avx(ZEXT1632(auVar92));
        auVar27._28_4_ = auVar181._28_4_;
        auVar27._0_28_ =
             ZEXT1628(CONCAT412(fVar109 * 0.0,
                                CONCAT48(fVar108 * 0.0,CONCAT44(fVar107 * 0.0,fVar127 * 0.0))));
        fVar127 = auVar105._0_4_;
        fVar107 = auVar105._4_4_;
        fVar108 = auVar105._8_4_;
        fVar109 = auVar105._12_4_;
        fVar110 = auVar105._16_4_;
        fVar111 = auVar105._20_4_;
        fVar112 = auVar105._24_4_;
        auVar28._4_4_ = fVar107 * fVar107 * fVar107 * auVar92._4_4_ * -0.5;
        auVar28._0_4_ = fVar127 * fVar127 * fVar127 * auVar92._0_4_ * -0.5;
        auVar28._8_4_ = fVar108 * fVar108 * fVar108 * auVar92._8_4_ * -0.5;
        auVar28._12_4_ = fVar109 * fVar109 * fVar109 * auVar92._12_4_ * -0.5;
        auVar28._16_4_ = fVar110 * fVar110 * fVar110 * -0.0;
        auVar28._20_4_ = fVar111 * fVar111 * fVar111 * -0.0;
        auVar28._24_4_ = fVar112 * fVar112 * fVar112 * -0.0;
        auVar28._28_4_ = 0;
        auVar92 = vfmadd231ps_fma(auVar28,auVar214,auVar105);
        fVar127 = auVar92._0_4_;
        fVar107 = auVar92._4_4_;
        auVar29._4_4_ = auVar8._4_4_ * fVar107;
        auVar29._0_4_ = auVar8._0_4_ * fVar127;
        fVar108 = auVar92._8_4_;
        auVar29._8_4_ = auVar8._8_4_ * fVar108;
        fVar109 = auVar92._12_4_;
        auVar29._12_4_ = auVar8._12_4_ * fVar109;
        auVar29._16_4_ = auVar8._16_4_ * 0.0;
        auVar29._20_4_ = auVar8._20_4_ * 0.0;
        auVar29._24_4_ = auVar8._24_4_ * 0.0;
        auVar29._28_4_ = 0;
        auVar30._4_4_ = -auVar97._4_4_ * fVar107;
        auVar30._0_4_ = -auVar97._0_4_ * fVar127;
        auVar30._8_4_ = -auVar97._8_4_ * fVar108;
        auVar30._12_4_ = -auVar97._12_4_ * fVar109;
        auVar30._16_4_ = -auVar97._16_4_ * 0.0;
        auVar30._20_4_ = -auVar97._20_4_ * 0.0;
        auVar30._24_4_ = -auVar97._24_4_ * 0.0;
        auVar30._28_4_ = auVar8._28_4_;
        auVar31._28_4_ = auVar105._28_4_;
        auVar31._0_28_ =
             ZEXT1628(CONCAT412(fVar109 * 0.0,
                                CONCAT48(fVar108 * 0.0,CONCAT44(fVar107 * 0.0,fVar127 * 0.0))));
        auVar92 = vfmadd213ps_fma(auVar25,ZEXT1632(auVar17),auVar117);
        auVar97 = ZEXT1632(auVar17);
        auVar129 = vfmadd213ps_fma(auVar26,auVar97,auVar210);
        auVar115 = vfmadd213ps_fma(auVar27,auVar97,ZEXT1632(auVar16));
        auVar116 = vfnmadd213ps_fma(auVar25,auVar97,auVar117);
        auVar91 = vfmadd213ps_fma(auVar29,ZEXT1632(auVar93),auVar98);
        auVar142 = vfnmadd213ps_fma(auVar26,auVar97,auVar210);
        auVar177 = ZEXT1632(auVar93);
        auVar93 = vfmadd213ps_fma(auVar30,auVar177,auVar134);
        auVar158 = ZEXT1632(auVar17);
        auVar114 = vfnmadd231ps_fma(ZEXT1632(auVar16),auVar158,auVar27);
        auVar16 = vfmadd213ps_fma(auVar31,auVar177,ZEXT1632(auVar152));
        auVar150 = vfnmadd213ps_fma(auVar29,auVar177,auVar98);
        auVar90 = vfnmadd213ps_fma(auVar30,auVar177,auVar134);
        auVar149 = vfnmadd231ps_fma(ZEXT1632(auVar152),auVar177,auVar31);
        auVar97 = vsubps_avx(ZEXT1632(auVar93),ZEXT1632(auVar142));
        auVar105 = vsubps_avx(ZEXT1632(auVar16),ZEXT1632(auVar114));
        auVar98._4_4_ = auVar114._4_4_ * auVar97._4_4_;
        auVar98._0_4_ = auVar114._0_4_ * auVar97._0_4_;
        auVar98._8_4_ = auVar114._8_4_ * auVar97._8_4_;
        auVar98._12_4_ = auVar114._12_4_ * auVar97._12_4_;
        auVar98._16_4_ = auVar97._16_4_ * 0.0;
        auVar98._20_4_ = auVar97._20_4_ * 0.0;
        auVar98._24_4_ = auVar97._24_4_ * 0.0;
        auVar98._28_4_ = 0;
        auVar17 = vfmsub231ps_fma(auVar98,ZEXT1632(auVar142),auVar105);
        auVar117._4_4_ = auVar116._4_4_ * auVar105._4_4_;
        auVar117._0_4_ = auVar116._0_4_ * auVar105._0_4_;
        auVar117._8_4_ = auVar116._8_4_ * auVar105._8_4_;
        auVar117._12_4_ = auVar116._12_4_ * auVar105._12_4_;
        auVar117._16_4_ = auVar105._16_4_ * 0.0;
        auVar117._20_4_ = auVar105._20_4_ * 0.0;
        auVar117._24_4_ = auVar105._24_4_ * 0.0;
        auVar117._28_4_ = auVar105._28_4_;
        auVar181 = ZEXT1632(auVar116);
        auVar105 = vsubps_avx(ZEXT1632(auVar91),auVar181);
        auVar152 = vfmsub231ps_fma(auVar117,ZEXT1632(auVar114),auVar105);
        auVar134._4_4_ = auVar142._4_4_ * auVar105._4_4_;
        auVar134._0_4_ = auVar142._0_4_ * auVar105._0_4_;
        auVar134._8_4_ = auVar142._8_4_ * auVar105._8_4_;
        auVar134._12_4_ = auVar142._12_4_ * auVar105._12_4_;
        auVar134._16_4_ = auVar105._16_4_ * 0.0;
        auVar134._20_4_ = auVar105._20_4_ * 0.0;
        auVar134._24_4_ = auVar105._24_4_ * 0.0;
        auVar134._28_4_ = auVar105._28_4_;
        auVar116 = vfmsub231ps_fma(auVar134,auVar181,auVar97);
        auVar152 = vfmadd231ps_fma(ZEXT1632(auVar116),ZEXT832(0) << 0x20,ZEXT1632(auVar152));
        auVar152 = vfmadd231ps_fma(ZEXT1632(auVar152),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
        auVar138 = vcmpps_avx(ZEXT1632(auVar152),ZEXT832(0) << 0x20,2);
        auVar97 = vblendvps_avx(ZEXT1632(auVar150),ZEXT1632(auVar92),auVar138);
        auVar105 = vblendvps_avx(ZEXT1632(auVar90),ZEXT1632(auVar129),auVar138);
        auVar104 = vblendvps_avx(ZEXT1632(auVar149),ZEXT1632(auVar115),auVar138);
        auVar122 = vblendvps_avx(auVar181,ZEXT1632(auVar91),auVar138);
        auVar205 = vblendvps_avx(ZEXT1632(auVar142),ZEXT1632(auVar93),auVar138);
        auVar8 = vblendvps_avx(ZEXT1632(auVar114),ZEXT1632(auVar16),auVar138);
        auVar181 = vblendvps_avx(ZEXT1632(auVar91),auVar181,auVar138);
        auVar99 = vblendvps_avx(ZEXT1632(auVar93),ZEXT1632(auVar142),auVar138);
        auVar152 = vpackssdw_avx(auVar14._0_16_,auVar14._16_16_);
        auVar19 = vblendvps_avx(ZEXT1632(auVar16),ZEXT1632(auVar114),auVar138);
        auVar170 = vsubps_avx(auVar181,auVar97);
        auVar99 = vsubps_avx(auVar99,auVar105);
        auVar18 = vsubps_avx(auVar19,auVar104);
        auVar98 = vsubps_avx(auVar97,auVar122);
        auVar117 = vsubps_avx(auVar105,auVar205);
        auVar118 = vsubps_avx(auVar104,auVar8);
        auVar210._4_4_ = auVar18._4_4_ * auVar97._4_4_;
        auVar210._0_4_ = auVar18._0_4_ * auVar97._0_4_;
        auVar210._8_4_ = auVar18._8_4_ * auVar97._8_4_;
        auVar210._12_4_ = auVar18._12_4_ * auVar97._12_4_;
        auVar210._16_4_ = auVar18._16_4_ * auVar97._16_4_;
        auVar210._20_4_ = auVar18._20_4_ * auVar97._20_4_;
        auVar210._24_4_ = auVar18._24_4_ * auVar97._24_4_;
        auVar210._28_4_ = auVar19._28_4_;
        auVar16 = vfmsub231ps_fma(auVar210,auVar104,auVar170);
        auVar32._4_4_ = auVar170._4_4_ * auVar105._4_4_;
        auVar32._0_4_ = auVar170._0_4_ * auVar105._0_4_;
        auVar32._8_4_ = auVar170._8_4_ * auVar105._8_4_;
        auVar32._12_4_ = auVar170._12_4_ * auVar105._12_4_;
        auVar32._16_4_ = auVar170._16_4_ * auVar105._16_4_;
        auVar32._20_4_ = auVar170._20_4_ * auVar105._20_4_;
        auVar32._24_4_ = auVar170._24_4_ * auVar105._24_4_;
        auVar32._28_4_ = auVar181._28_4_;
        auVar17 = vfmsub231ps_fma(auVar32,auVar97,auVar99);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
        auVar101._0_4_ = auVar99._0_4_ * auVar104._0_4_;
        auVar101._4_4_ = auVar99._4_4_ * auVar104._4_4_;
        auVar101._8_4_ = auVar99._8_4_ * auVar104._8_4_;
        auVar101._12_4_ = auVar99._12_4_ * auVar104._12_4_;
        auVar101._16_4_ = auVar99._16_4_ * auVar104._16_4_;
        auVar101._20_4_ = auVar99._20_4_ * auVar104._20_4_;
        auVar101._24_4_ = auVar99._24_4_ * auVar104._24_4_;
        auVar101._28_4_ = 0;
        auVar17 = vfmsub231ps_fma(auVar101,auVar105,auVar18);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
        auVar102._0_4_ = auVar118._0_4_ * auVar122._0_4_;
        auVar102._4_4_ = auVar118._4_4_ * auVar122._4_4_;
        auVar102._8_4_ = auVar118._8_4_ * auVar122._8_4_;
        auVar102._12_4_ = auVar118._12_4_ * auVar122._12_4_;
        auVar102._16_4_ = auVar118._16_4_ * auVar122._16_4_;
        auVar102._20_4_ = auVar118._20_4_ * auVar122._20_4_;
        auVar102._24_4_ = auVar118._24_4_ * auVar122._24_4_;
        auVar102._28_4_ = 0;
        auVar16 = vfmsub231ps_fma(auVar102,auVar98,auVar8);
        auVar33._4_4_ = auVar117._4_4_ * auVar8._4_4_;
        auVar33._0_4_ = auVar117._0_4_ * auVar8._0_4_;
        auVar33._8_4_ = auVar117._8_4_ * auVar8._8_4_;
        auVar33._12_4_ = auVar117._12_4_ * auVar8._12_4_;
        auVar33._16_4_ = auVar117._16_4_ * auVar8._16_4_;
        auVar33._20_4_ = auVar117._20_4_ * auVar8._20_4_;
        auVar33._24_4_ = auVar117._24_4_ * auVar8._24_4_;
        auVar33._28_4_ = auVar8._28_4_;
        auVar93 = vfmsub231ps_fma(auVar33,auVar205,auVar118);
        auVar34._4_4_ = auVar98._4_4_ * auVar205._4_4_;
        auVar34._0_4_ = auVar98._0_4_ * auVar205._0_4_;
        auVar34._8_4_ = auVar98._8_4_ * auVar205._8_4_;
        auVar34._12_4_ = auVar98._12_4_ * auVar205._12_4_;
        auVar34._16_4_ = auVar98._16_4_ * auVar205._16_4_;
        auVar34._20_4_ = auVar98._20_4_ * auVar205._20_4_;
        auVar34._24_4_ = auVar98._24_4_ * auVar205._24_4_;
        auVar34._28_4_ = auVar205._28_4_;
        auVar92 = vfmsub231ps_fma(auVar34,auVar117,auVar122);
        auVar205 = ZEXT832(0) << 0x20;
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar205,ZEXT1632(auVar16));
        auVar93 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar205,ZEXT1632(auVar93));
        auVar122 = vmaxps_avx(ZEXT1632(auVar17),ZEXT1632(auVar93));
        auVar122 = vcmpps_avx(auVar122,ZEXT832(0) << 0x20,2);
        auVar16 = vpackssdw_avx(auVar122._0_16_,auVar122._16_16_);
        auVar152 = vpand_avx(auVar152,auVar16);
        auVar122 = vpmovsxwd_avx2(auVar152);
        if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar122 >> 0x7f,0) == '\0') &&
              (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar122 >> 0xbf,0) == '\0') &&
            (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar122[0x1f]) {
LAB_0167b585:
          auVar167 = ZEXT3264(CONCAT824(uStack_5e8,
                                        CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
          auVar189 = ZEXT3264(CONCAT428(local_6e0,
                                        CONCAT424(local_6e0,
                                                  CONCAT420(local_6e0,
                                                            CONCAT416(local_6e0,
                                                                      CONCAT412(local_6e0,
                                                                                CONCAT48(local_6e0,
                                                                                         CONCAT44(
                                                  local_6e0,local_6e0))))))));
        }
        else {
          auVar35._4_4_ = auVar99._4_4_ * auVar118._4_4_;
          auVar35._0_4_ = auVar99._0_4_ * auVar118._0_4_;
          auVar35._8_4_ = auVar99._8_4_ * auVar118._8_4_;
          auVar35._12_4_ = auVar99._12_4_ * auVar118._12_4_;
          auVar35._16_4_ = auVar99._16_4_ * auVar118._16_4_;
          auVar35._20_4_ = auVar99._20_4_ * auVar118._20_4_;
          auVar35._24_4_ = auVar99._24_4_ * auVar118._24_4_;
          auVar35._28_4_ = auVar122._28_4_;
          auVar115 = vfmsub231ps_fma(auVar35,auVar117,auVar18);
          auVar120._0_4_ = auVar98._0_4_ * auVar18._0_4_;
          auVar120._4_4_ = auVar98._4_4_ * auVar18._4_4_;
          auVar120._8_4_ = auVar98._8_4_ * auVar18._8_4_;
          auVar120._12_4_ = auVar98._12_4_ * auVar18._12_4_;
          auVar120._16_4_ = auVar98._16_4_ * auVar18._16_4_;
          auVar120._20_4_ = auVar98._20_4_ * auVar18._20_4_;
          auVar120._24_4_ = auVar98._24_4_ * auVar18._24_4_;
          auVar120._28_4_ = 0;
          auVar129 = vfmsub231ps_fma(auVar120,auVar170,auVar118);
          auVar36._4_4_ = auVar170._4_4_ * auVar117._4_4_;
          auVar36._0_4_ = auVar170._0_4_ * auVar117._0_4_;
          auVar36._8_4_ = auVar170._8_4_ * auVar117._8_4_;
          auVar36._12_4_ = auVar170._12_4_ * auVar117._12_4_;
          auVar36._16_4_ = auVar170._16_4_ * auVar117._16_4_;
          auVar36._20_4_ = auVar170._20_4_ * auVar117._20_4_;
          auVar36._24_4_ = auVar170._24_4_ * auVar117._24_4_;
          auVar36._28_4_ = auVar170._28_4_;
          auVar91 = vfmsub231ps_fma(auVar36,auVar98,auVar99);
          auVar16 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar129),ZEXT1632(auVar91));
          auVar92 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT1632(auVar115),auVar205);
          auVar122 = vrcpps_avx(ZEXT1632(auVar92));
          auVar203._8_4_ = 0x3f800000;
          auVar203._0_8_ = &DAT_3f8000003f800000;
          auVar203._12_4_ = 0x3f800000;
          auVar203._16_4_ = 0x3f800000;
          auVar203._20_4_ = 0x3f800000;
          auVar203._24_4_ = 0x3f800000;
          auVar203._28_4_ = 0x3f800000;
          auVar16 = vfnmadd213ps_fma(auVar122,ZEXT1632(auVar92),auVar203);
          auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar122,auVar122);
          auVar37._4_4_ = auVar91._4_4_ * auVar104._4_4_;
          auVar37._0_4_ = auVar91._0_4_ * auVar104._0_4_;
          auVar37._8_4_ = auVar91._8_4_ * auVar104._8_4_;
          auVar37._12_4_ = auVar91._12_4_ * auVar104._12_4_;
          auVar37._16_4_ = auVar104._16_4_ * 0.0;
          auVar37._20_4_ = auVar104._20_4_ * 0.0;
          auVar37._24_4_ = auVar104._24_4_ * 0.0;
          auVar37._28_4_ = auVar104._28_4_;
          auVar129 = vfmadd231ps_fma(auVar37,auVar105,ZEXT1632(auVar129));
          auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),ZEXT1632(auVar115),auVar97);
          fVar127 = auVar16._0_4_;
          fVar107 = auVar16._4_4_;
          fVar108 = auVar16._8_4_;
          fVar109 = auVar16._12_4_;
          auVar38._28_4_ = auVar105._28_4_;
          auVar38._0_28_ =
               ZEXT1628(CONCAT412(fVar109 * auVar129._12_4_,
                                  CONCAT48(fVar108 * auVar129._8_4_,
                                           CONCAT44(fVar107 * auVar129._4_4_,
                                                    fVar127 * auVar129._0_4_))));
          auVar103._4_4_ = uVar88;
          auVar103._0_4_ = uVar88;
          auVar103._8_4_ = uVar88;
          auVar103._12_4_ = uVar88;
          auVar103._16_4_ = uVar88;
          auVar103._20_4_ = uVar88;
          auVar103._24_4_ = uVar88;
          auVar103._28_4_ = uVar88;
          uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar121._4_4_ = uVar4;
          auVar121._0_4_ = uVar4;
          auVar121._8_4_ = uVar4;
          auVar121._12_4_ = uVar4;
          auVar121._16_4_ = uVar4;
          auVar121._20_4_ = uVar4;
          auVar121._24_4_ = uVar4;
          auVar121._28_4_ = uVar4;
          auVar97 = vcmpps_avx(auVar103,auVar38,2);
          auVar105 = vcmpps_avx(auVar38,auVar121,2);
          auVar97 = vandps_avx(auVar105,auVar97);
          auVar16 = vpackssdw_avx(auVar97._0_16_,auVar97._16_16_);
          auVar152 = vpand_avx(auVar152,auVar16);
          auVar97 = vpmovsxwd_avx2(auVar152);
          if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar97 >> 0x7f,0) == '\0') &&
                (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar97 >> 0xbf,0) == '\0') &&
              (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar97[0x1f]) goto LAB_0167b585;
          auVar97 = vcmpps_avx(auVar205,ZEXT1632(auVar92),4);
          auVar16 = vpackssdw_avx(auVar97._0_16_,auVar97._16_16_);
          auVar152 = vpand_avx(auVar152,auVar16);
          auVar97 = vpmovsxwd_avx2(auVar152);
          auVar167 = ZEXT3264(CONCAT824(uStack_5e8,
                                        CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
          auVar189 = ZEXT3264(CONCAT428(local_6e0,
                                        CONCAT424(local_6e0,
                                                  CONCAT420(local_6e0,
                                                            CONCAT416(local_6e0,
                                                                      CONCAT412(local_6e0,
                                                                                CONCAT48(local_6e0,
                                                                                         CONCAT44(
                                                  local_6e0,local_6e0))))))));
          if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar97 >> 0x7f,0) != '\0') ||
                (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar97 >> 0xbf,0) != '\0') ||
              (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar97[0x1f] < '\0') {
            auVar104 = ZEXT1632(CONCAT412(fVar109 * auVar17._12_4_,
                                          CONCAT48(fVar108 * auVar17._8_4_,
                                                   CONCAT44(fVar107 * auVar17._4_4_,
                                                            fVar127 * auVar17._0_4_))));
            auVar122 = ZEXT1632(CONCAT412(fVar109 * auVar93._12_4_,
                                          CONCAT48(fVar108 * auVar93._8_4_,
                                                   CONCAT44(fVar107 * auVar93._4_4_,
                                                            fVar127 * auVar93._0_4_))));
            auVar159._8_4_ = 0x3f800000;
            auVar159._0_8_ = &DAT_3f8000003f800000;
            auVar159._12_4_ = 0x3f800000;
            auVar159._16_4_ = 0x3f800000;
            auVar159._20_4_ = 0x3f800000;
            auVar159._24_4_ = 0x3f800000;
            auVar159._28_4_ = 0x3f800000;
            auVar105 = vsubps_avx(auVar159,auVar104);
            local_100 = vblendvps_avx(auVar105,auVar104,auVar138);
            auVar105 = vsubps_avx(auVar159,auVar122);
            local_4a0 = vblendvps_avx(auVar105,auVar122,auVar138);
            auVar167 = ZEXT3264(auVar97);
            local_2a0 = auVar38;
          }
        }
        auVar207 = ZEXT3264(_local_720);
        auVar147 = ZEXT3264(auVar163);
        auVar97 = auVar167._0_32_;
        if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar97 >> 0x7f,0) == '\0') &&
              (auVar167 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar97 >> 0xbf,0) == '\0') &&
            (auVar167 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar167[0x1f]) {
          bVar78 = false;
          auVar125 = ZEXT3264(CONCAT428(fVar148,CONCAT424(fVar141,CONCAT420(fVar148,CONCAT416(
                                                  fVar141,CONCAT412(fVar148,CONCAT48(fVar141,uVar89)
                                                                   ))))));
        }
        else {
          auVar105 = vsubps_avx(auVar177,auVar158);
          auVar152 = vfmadd213ps_fma(auVar105,local_100,auVar158);
          fVar127 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar39._4_4_ = (auVar152._4_4_ + auVar152._4_4_) * fVar127;
          auVar39._0_4_ = (auVar152._0_4_ + auVar152._0_4_) * fVar127;
          auVar39._8_4_ = (auVar152._8_4_ + auVar152._8_4_) * fVar127;
          auVar39._12_4_ = (auVar152._12_4_ + auVar152._12_4_) * fVar127;
          auVar39._16_4_ = fVar127 * 0.0;
          auVar39._20_4_ = fVar127 * 0.0;
          auVar39._24_4_ = fVar127 * 0.0;
          auVar39._28_4_ = 0;
          auVar105 = vcmpps_avx(local_2a0,auVar39,6);
          auVar104 = auVar97 & auVar105;
          if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar104 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar104 >> 0x7f,0) != '\0') ||
                (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar104 >> 0xbf,0) != '\0') ||
              (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar104[0x1f] < '\0') {
            local_380 = vandps_avx(auVar105,auVar97);
            auVar123._8_4_ = 0xbf800000;
            auVar123._0_8_ = 0xbf800000bf800000;
            auVar123._12_4_ = 0xbf800000;
            auVar123._16_4_ = 0xbf800000;
            auVar123._20_4_ = 0xbf800000;
            auVar123._24_4_ = 0xbf800000;
            auVar123._28_4_ = 0xbf800000;
            auVar136._8_4_ = 0x40000000;
            auVar136._0_8_ = 0x4000000040000000;
            auVar136._12_4_ = 0x40000000;
            auVar136._16_4_ = 0x40000000;
            auVar136._20_4_ = 0x40000000;
            auVar136._24_4_ = 0x40000000;
            auVar136._28_4_ = 0x40000000;
            auVar152 = vfmadd213ps_fma(local_4a0,auVar136,auVar123);
            local_440 = local_100;
            local_420 = ZEXT1632(auVar152);
            local_400 = local_2a0;
            local_3e0 = 0;
            local_3c0 = local_610._0_8_;
            uStack_3b8 = local_610._8_8_;
            local_3b0 = local_620._0_8_;
            uStack_3a8 = local_620._8_8_;
            local_3a0 = local_630._0_8_;
            uStack_398 = local_630._8_8_;
            local_4a0 = local_420;
            if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              auVar125 = ZEXT3264(CONCAT428(fVar148,CONCAT424(fVar141,CONCAT420(fVar148,CONCAT416(
                                                  fVar141,CONCAT412(fVar148,CONCAT48(fVar141,uVar89)
                                                                   ))))));
              if (context->args->filter == (RTCFilterFunctionN)0x0) {
                auVar167 = ZEXT3264(auVar163);
                bVar78 = true;
                if (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0) goto LAB_0167a0c2;
              }
              fVar127 = 1.0 / auVar100._0_4_;
              local_360[0] = fVar127 * (local_100._0_4_ + 0.0);
              local_360[1] = fVar127 * (local_100._4_4_ + 1.0);
              local_360[2] = fVar127 * (local_100._8_4_ + 2.0);
              local_360[3] = fVar127 * (local_100._12_4_ + 3.0);
              fStack_350 = fVar127 * (local_100._16_4_ + 4.0);
              fStack_34c = fVar127 * (local_100._20_4_ + 5.0);
              fStack_348 = fVar127 * (local_100._24_4_ + 6.0);
              fStack_344 = local_100._28_4_ + 7.0;
              local_4a0._0_8_ = auVar152._0_8_;
              local_4a0._8_8_ = auVar152._8_8_;
              local_340 = local_4a0._0_8_;
              uStack_338 = local_4a0._8_8_;
              uStack_330 = 0;
              uStack_328 = 0;
              local_320 = local_2a0._0_8_;
              uStack_318 = local_2a0._8_8_;
              uStack_310 = local_2a0._16_8_;
              uStack_308 = local_2a0._24_8_;
              uVar80 = vmovmskps_avx(local_380);
              bVar78 = uVar80 != 0;
              if (uVar80 == 0) {
                auVar125 = ZEXT3264(CONCAT428(fVar148,CONCAT424(fVar141,CONCAT420(fVar148,CONCAT416(
                                                  fVar141,CONCAT412(fVar148,CONCAT48(fVar141,uVar89)
                                                                   ))))));
              }
              else {
                uVar81 = 0;
                uVar83 = (ulong)(uVar80 & 0xff);
                for (uVar22 = uVar83; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000)
                {
                  uVar81 = uVar81 + 1;
                }
                local_6c0._4_4_ = uVar82;
                local_6c0._0_4_ = uVar82;
                local_6c0._8_4_ = uVar82;
                local_6c0._12_4_ = uVar82;
                local_6c0._16_4_ = uVar82;
                local_6c0._20_4_ = uVar82;
                local_6c0._24_4_ = uVar82;
                local_6c0._28_4_ = uVar82;
                local_680._0_4_ = local_680._4_4_;
                local_680._8_4_ = local_680._4_4_;
                local_680._12_4_ = local_680._4_4_;
                local_680._16_4_ = local_680._4_4_;
                local_680._20_4_ = local_680._4_4_;
                local_680._24_4_ = local_680._4_4_;
                local_680._28_4_ = local_680._4_4_;
                local_520._16_16_ = auVar14._16_16_;
                local_520._0_16_ = local_610;
                local_540 = ZEXT1632(local_620);
                auStack_550 = auVar106._16_16_;
                _local_560 = local_630;
                _local_700 = auVar163;
                local_3dc = iVar79;
                local_3d0 = uVar71;
                uStack_3c8 = uVar72;
                do {
                  uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
                  fVar127 = local_360[uVar81];
                  auVar95._4_4_ = fVar127;
                  auVar95._0_4_ = fVar127;
                  auVar95._8_4_ = fVar127;
                  auVar95._12_4_ = fVar127;
                  local_220._16_4_ = fVar127;
                  local_220._0_16_ = auVar95;
                  local_220._20_4_ = fVar127;
                  local_220._24_4_ = fVar127;
                  local_220._28_4_ = fVar127;
                  uVar5 = *(undefined4 *)((long)&local_340 + uVar81 * 4);
                  local_200._4_4_ = uVar5;
                  local_200._0_4_ = uVar5;
                  local_200._8_4_ = uVar5;
                  local_200._12_4_ = uVar5;
                  local_200._16_4_ = uVar5;
                  local_200._20_4_ = uVar5;
                  local_200._24_4_ = uVar5;
                  local_200._28_4_ = uVar5;
                  *(undefined4 *)(ray + k * 4 + 0x100) =
                       *(undefined4 *)((long)&local_320 + uVar81 * 4);
                  fVar108 = 1.0 - fVar127;
                  auVar152 = ZEXT416((uint)(fVar127 * fVar108 * 4.0));
                  auVar16 = vfnmsub213ss_fma(auVar95,auVar95,auVar152);
                  auVar152 = vfmadd213ss_fma(ZEXT416((uint)fVar108),ZEXT416((uint)fVar108),auVar152)
                  ;
                  fVar107 = auVar152._0_4_ * 0.5;
                  fVar127 = fVar127 * fVar127 * 0.5;
                  auVar153._0_4_ = fVar127 * (float)local_560._0_4_;
                  auVar153._4_4_ = fVar127 * (float)local_560._4_4_;
                  auVar153._8_4_ = fVar127 * fStack_558;
                  auVar153._12_4_ = fVar127 * fStack_554;
                  auVar130._4_4_ = fVar107;
                  auVar130._0_4_ = fVar107;
                  auVar130._8_4_ = fVar107;
                  auVar130._12_4_ = fVar107;
                  auVar152 = vfmadd132ps_fma(auVar130,auVar153,local_540._0_16_);
                  fVar127 = auVar16._0_4_ * 0.5;
                  auVar154._4_4_ = fVar127;
                  auVar154._0_4_ = fVar127;
                  auVar154._8_4_ = fVar127;
                  auVar154._12_4_ = fVar127;
                  auVar152 = vfmadd132ps_fma(auVar154,auVar152,local_520._0_16_);
                  local_750.context = context->user;
                  fVar127 = fVar108 * -fVar108 * 0.5;
                  auVar131._4_4_ = fVar127;
                  auVar131._0_4_ = fVar127;
                  auVar131._8_4_ = fVar127;
                  auVar131._12_4_ = fVar127;
                  auVar16 = vfmadd132ps_fma(auVar131,auVar152,auVar155);
                  local_280 = auVar16._0_4_;
                  uStack_27c = local_280;
                  uStack_278 = local_280;
                  uStack_274 = local_280;
                  uStack_270 = local_280;
                  uStack_26c = local_280;
                  uStack_268 = local_280;
                  uStack_264 = local_280;
                  auVar152 = vmovshdup_avx(auVar16);
                  local_260 = auVar152._0_8_;
                  uStack_258 = local_260;
                  uStack_250 = local_260;
                  uStack_248 = local_260;
                  auVar152 = vshufps_avx(auVar16,auVar16,0xaa);
                  local_240 = auVar152._0_8_;
                  uStack_238 = local_240;
                  uStack_230 = local_240;
                  uStack_228 = local_240;
                  local_1e0 = local_680._0_8_;
                  uStack_1d8 = local_680._8_8_;
                  uStack_1d0 = local_680._16_8_;
                  uStack_1c8 = local_680._24_8_;
                  local_1c0 = local_6c0;
                  auVar97 = vpcmpeqd_avx2(local_200,local_200);
                  local_1a0 = (local_750.context)->instID[0];
                  uStack_19c = local_1a0;
                  uStack_198 = local_1a0;
                  uStack_194 = local_1a0;
                  uStack_190 = local_1a0;
                  uStack_18c = local_1a0;
                  uStack_188 = local_1a0;
                  uStack_184 = local_1a0;
                  local_180 = (local_750.context)->instPrimID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_660 = local_2c0._0_8_;
                  uStack_658 = local_2c0._8_8_;
                  uStack_650 = local_2c0._16_8_;
                  uStack_648 = local_2c0._24_8_;
                  local_750.valid = (int *)&local_660;
                  local_750.geometryUserPtr = *(void **)(CONCAT44(uStack_5dc,local_5e0) + 0x18);
                  local_750.hit = (RTCHitN *)&local_280;
                  local_750.N = 8;
                  pcVar11 = *(code **)(CONCAT44(uStack_5dc,local_5e0) + 0x48);
                  local_750.ray = (RTCRayN *)ray;
                  if (pcVar11 != (code *)0x0) {
                    (*pcVar11)(&local_750);
                    auVar167._8_56_ = extraout_var;
                    auVar167._0_8_ = extraout_XMM1_Qa;
                    auVar207 = ZEXT3264(_local_720);
                    auVar147 = ZEXT3264(_local_700);
                    auVar189 = ZEXT3264(CONCAT428(fStack_6c4,
                                                  CONCAT424(fStack_6c8,
                                                            CONCAT420(fStack_6cc,
                                                                      CONCAT416(fStack_6d0,
                                                                                CONCAT412(fStack_6d4
                                                                                          ,CONCAT48(
                                                  fStack_6d8,CONCAT44(fStack_6dc,local_6e0))))))));
                    auVar97 = vpcmpeqd_avx2(auVar167._0_32_,auVar167._0_32_);
                  }
                  auVar106._8_8_ = uStack_658;
                  auVar106._0_8_ = local_660;
                  auVar106._16_8_ = uStack_650;
                  auVar106._24_8_ = uStack_648;
                  auVar104 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar106);
                  auVar105 = auVar97 & ~auVar104;
                  if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar105 >> 0x7f,0) == '\0') &&
                        (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar105 >> 0xbf,0) == '\0') &&
                      (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar105[0x1f]) {
                    auVar104 = auVar104 ^ auVar97;
                  }
                  else {
                    p_Var12 = context->args->filter;
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(CONCAT44(uStack_5dc,local_5e0) + 0x3e) & 0x40) != 0)))) {
                      (*p_Var12)(&local_750);
                      auVar207 = ZEXT3264(_local_720);
                      auVar147 = ZEXT3264(_local_700);
                      auVar189 = ZEXT3264(CONCAT428(fStack_6c4,
                                                    CONCAT424(fStack_6c8,
                                                              CONCAT420(fStack_6cc,
                                                                        CONCAT416(fStack_6d0,
                                                                                  CONCAT412(
                                                  fStack_6d4,
                                                  CONCAT48(fStack_6d8,CONCAT44(fStack_6dc,local_6e0)
                                                          )))))));
                    }
                    auVar73._8_8_ = uStack_658;
                    auVar73._0_8_ = local_660;
                    auVar73._16_8_ = uStack_650;
                    auVar73._24_8_ = uStack_648;
                    auVar105 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                    auVar97 = vpcmpeqd_avx2(auVar105,auVar73);
                    auVar104 = vpcmpeqd_avx2(auVar105,auVar105);
                    auVar104 = auVar97 ^ auVar104;
                    auVar137._8_4_ = 0xff800000;
                    auVar137._0_8_ = 0xff800000ff800000;
                    auVar137._12_4_ = 0xff800000;
                    auVar137._16_4_ = 0xff800000;
                    auVar137._20_4_ = 0xff800000;
                    auVar137._24_4_ = 0xff800000;
                    auVar137._28_4_ = 0xff800000;
                    auVar97 = vblendvps_avx(auVar137,*(undefined1 (*) [32])(local_750.ray + 0x100),
                                            auVar97);
                    *(undefined1 (*) [32])(local_750.ray + 0x100) = auVar97;
                  }
                  auVar163 = auVar147._0_32_;
                  auVar125 = ZEXT3264(CONCAT428(fVar148,CONCAT424(fVar141,CONCAT420(fVar148,
                                                  CONCAT416(fVar141,CONCAT412(fVar148,CONCAT48(
                                                  fVar141,uVar89)))))));
                  if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar104 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar104 >> 0x7f,0) != '\0') ||
                        (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar104 >> 0xbf,0) != '\0') ||
                      (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar104[0x1f] < '\0') break;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar4;
                  uVar22 = uVar81 & 0x3f;
                  uVar81 = 0;
                  uVar83 = uVar83 ^ 1L << uVar22;
                  for (uVar22 = uVar83; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000
                      ) {
                    uVar81 = uVar81 + 1;
                  }
                  bVar78 = uVar83 != 0;
                } while (bVar78);
              }
              goto LAB_0167a0be;
            }
          }
          bVar78 = false;
          auVar125 = ZEXT3264(CONCAT428(fVar148,CONCAT424(fVar141,CONCAT420(fVar148,CONCAT416(
                                                  fVar141,CONCAT412(fVar148,CONCAT48(fVar141,uVar89)
                                                                   ))))));
        }
LAB_0167a0be:
        auVar167 = ZEXT3264(auVar163);
      }
LAB_0167a0c2:
      auVar147 = ZEXT3264(local_6a0);
      if (8 < iVar79) {
        _local_700 = auVar167._0_32_;
        local_540._4_4_ = iVar79;
        local_540._0_4_ = iVar79;
        local_540._8_4_ = iVar79;
        local_540._12_4_ = iVar79;
        local_540._16_4_ = iVar79;
        local_540._20_4_ = iVar79;
        local_540._24_4_ = iVar79;
        local_540._28_4_ = iVar79;
        local_480._4_4_ = fVar128;
        local_480._0_4_ = fVar128;
        fStack_478 = fVar128;
        fStack_474 = fVar128;
        fStack_470 = fVar128;
        fStack_46c = fVar128;
        fStack_468 = fVar128;
        fStack_464 = fVar128;
        local_160 = 1.0 / (float)local_5a0._0_4_;
        fStack_15c = local_160;
        fStack_158 = local_160;
        fStack_154 = local_160;
        fStack_150 = local_160;
        fStack_14c = local_160;
        fStack_148 = local_160;
        fStack_144 = local_160;
        local_120 = uVar82;
        uStack_11c = uVar82;
        uStack_118 = uVar82;
        uStack_114 = uVar82;
        uStack_110 = uVar82;
        uStack_10c = uVar82;
        uStack_108 = uVar82;
        uStack_104 = uVar82;
        local_140 = local_5c0._0_4_;
        uStack_13c = local_5c0._0_4_;
        uStack_138 = local_5c0._0_4_;
        uStack_134 = local_5c0._0_4_;
        uStack_130 = local_5c0._0_4_;
        uStack_12c = local_5c0._0_4_;
        uStack_128 = local_5c0._0_4_;
        uStack_124 = local_5c0._0_4_;
        lVar85 = 8;
        _local_720 = auVar207._0_32_;
        local_5e0 = uVar88;
        uStack_5dc = uVar88;
        uStack_5d8 = uVar88;
        uStack_5d4 = uVar88;
        uStack_5d0 = uVar88;
        uStack_5cc = uVar88;
        uStack_5c8 = uVar88;
        uStack_5c4 = uVar88;
        do {
          auVar97 = *(undefined1 (*) [32])(bspline_basis0 + lVar85 * 4 + lVar20);
          auVar105 = *(undefined1 (*) [32])(lVar20 + 0x222bfac + lVar85 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar20 + 0x222c430 + lVar85 * 4);
          pauVar2 = (undefined1 (*) [32])(lVar20 + 0x222c8b4 + lVar85 * 4);
          auVar77 = *(undefined1 (*) [28])*pauVar2;
          fVar183 = auVar189._0_4_;
          auVar208._0_4_ = fVar183 * *(float *)*pauVar2;
          fVar190 = auVar189._4_4_;
          auVar208._4_4_ = fVar190 * *(float *)(*pauVar2 + 4);
          fVar191 = auVar189._8_4_;
          auVar208._8_4_ = fVar191 * *(float *)(*pauVar2 + 8);
          fVar192 = auVar189._12_4_;
          auVar208._12_4_ = fVar192 * *(float *)(*pauVar2 + 0xc);
          fVar193 = auVar189._16_4_;
          auVar208._16_4_ = fVar193 * *(float *)(*pauVar2 + 0x10);
          fVar194 = auVar189._20_4_;
          auVar208._20_4_ = fVar194 * *(float *)(*pauVar2 + 0x14);
          fVar195 = auVar189._24_4_;
          auVar208._28_36_ = auVar207._28_36_;
          auVar208._24_4_ = fVar195 * *(float *)(*pauVar2 + 0x18);
          auVar207._0_4_ = auVar125._0_4_ * *(float *)*pauVar2;
          auVar207._4_4_ = auVar125._4_4_ * *(float *)(*pauVar2 + 4);
          auVar207._8_4_ = auVar125._8_4_ * *(float *)(*pauVar2 + 8);
          auVar207._12_4_ = auVar125._12_4_ * *(float *)(*pauVar2 + 0xc);
          auVar207._16_4_ = auVar125._16_4_ * *(float *)(*pauVar2 + 0x10);
          auVar207._20_4_ = auVar125._20_4_ * *(float *)(*pauVar2 + 0x14);
          auVar207._28_36_ = auVar167._28_36_;
          auVar207._24_4_ = auVar125._24_4_ * *(float *)(*pauVar2 + 0x18);
          auVar155 = vfmadd231ps_fma(auVar208._0_32_,auVar104,auVar147._0_32_);
          auVar152 = vfmadd231ps_fma(auVar207._0_32_,auVar104,auVar201);
          auVar155 = vfmadd231ps_fma(ZEXT1632(auVar155),auVar105,auVar213);
          auVar152 = vfmadd231ps_fma(ZEXT1632(auVar152),auVar105,local_500);
          auVar155 = vfmadd231ps_fma(ZEXT1632(auVar155),auVar97,auVar185);
          auVar152 = vfmadd231ps_fma(ZEXT1632(auVar152),auVar97,local_580);
          auVar122 = *(undefined1 (*) [32])(bspline_basis1 + lVar85 * 4 + lVar20);
          auVar205 = *(undefined1 (*) [32])(lVar20 + 0x222e3cc + lVar85 * 4);
          auVar8 = *(undefined1 (*) [32])(lVar20 + 0x222e850 + lVar85 * 4);
          pfVar3 = (float *)(lVar20 + 0x222ecd4 + lVar85 * 4);
          fVar112 = *pfVar3;
          fVar126 = pfVar3[1];
          fVar209 = pfVar3[2];
          fVar216 = pfVar3[3];
          fVar217 = pfVar3[4];
          fVar218 = pfVar3[5];
          fVar219 = pfVar3[6];
          auVar40._4_4_ = fVar190 * fVar126;
          auVar40._0_4_ = fVar183 * fVar112;
          auVar40._8_4_ = fVar191 * fVar209;
          auVar40._12_4_ = fVar192 * fVar216;
          auVar40._16_4_ = fVar193 * fVar217;
          auVar40._20_4_ = fVar194 * fVar218;
          auVar40._24_4_ = fVar195 * fVar219;
          auVar40._28_4_ = auVar104._28_4_;
          auVar41._4_4_ = fVar126 * auVar125._4_4_;
          auVar41._0_4_ = fVar112 * auVar125._0_4_;
          auVar41._8_4_ = fVar209 * auVar125._8_4_;
          auVar41._12_4_ = fVar216 * auVar125._12_4_;
          auVar41._16_4_ = fVar217 * auVar125._16_4_;
          auVar41._20_4_ = fVar218 * auVar125._20_4_;
          auVar41._24_4_ = fVar219 * auVar125._24_4_;
          auVar41._28_4_ = auVar97._28_4_;
          auVar16 = vfmadd231ps_fma(auVar40,auVar8,auVar147._0_32_);
          auVar17 = vfmadd231ps_fma(auVar41,auVar8,auVar201);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar205,auVar213);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar205,local_500);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar122,auVar185);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar122,local_580);
          auVar170 = ZEXT1632(auVar16);
          _local_5c0 = ZEXT1632(auVar155);
          auVar14 = vsubps_avx(auVar170,_local_5c0);
          auVar138 = ZEXT1632(auVar17);
          local_5a0 = ZEXT1632(auVar152);
          auVar106 = vsubps_avx(auVar138,local_5a0);
          auVar70._4_4_ = auVar14._4_4_ * auVar152._4_4_;
          auVar70._0_4_ = auVar14._0_4_ * auVar152._0_4_;
          auVar70._8_4_ = auVar14._8_4_ * auVar152._8_4_;
          auVar70._12_4_ = auVar14._12_4_ * auVar152._12_4_;
          auVar70._16_4_ = auVar14._16_4_ * 0.0;
          auVar70._20_4_ = auVar14._20_4_ * 0.0;
          auVar70._24_4_ = auVar14._24_4_ * 0.0;
          auVar70._28_4_ = local_500._28_4_;
          auVar167 = ZEXT3264(auVar104);
          fVar128 = auVar106._0_4_;
          auVar147._0_4_ = auVar155._0_4_ * fVar128;
          fVar127 = auVar106._4_4_;
          auVar147._4_4_ = auVar155._4_4_ * fVar127;
          fVar107 = auVar106._8_4_;
          auVar147._8_4_ = auVar155._8_4_ * fVar107;
          fVar108 = auVar106._12_4_;
          auVar147._12_4_ = auVar155._12_4_ * fVar108;
          fVar109 = auVar106._16_4_;
          auVar147._16_4_ = fVar109 * 0.0;
          fVar110 = auVar106._20_4_;
          auVar147._20_4_ = fVar110 * 0.0;
          fVar111 = auVar106._24_4_;
          auVar147._28_36_ = auVar125._28_36_;
          auVar147._24_4_ = fVar111 * 0.0;
          auVar207 = ZEXT3264(*pauVar2);
          auVar99 = vsubps_avx(auVar70,auVar147._0_32_);
          auVar171._0_4_ = auVar77._0_4_ * (float)local_e0;
          auVar171._4_4_ = auVar77._4_4_ * local_e0._4_4_;
          auVar171._8_4_ = auVar77._8_4_ * (float)uStack_d8;
          auVar171._12_4_ = auVar77._12_4_ * uStack_d8._4_4_;
          auVar171._16_4_ = auVar77._16_4_ * (float)uStack_d0;
          auVar171._20_4_ = auVar77._20_4_ * uStack_d0._4_4_;
          auVar171._24_4_ = auVar77._24_4_ * (float)uStack_c8;
          auVar171._28_4_ = 0;
          auVar155 = vfmadd231ps_fma(auVar171,auVar104,local_c0);
          auVar155 = vfmadd231ps_fma(ZEXT1632(auVar155),auVar105,local_a0);
          auVar155 = vfmadd231ps_fma(ZEXT1632(auVar155),local_80,auVar97);
          auVar42._4_4_ = fVar126 * local_e0._4_4_;
          auVar42._0_4_ = fVar112 * (float)local_e0;
          auVar42._8_4_ = fVar209 * (float)uStack_d8;
          auVar42._12_4_ = fVar216 * uStack_d8._4_4_;
          auVar42._16_4_ = fVar217 * (float)uStack_d0;
          auVar42._20_4_ = fVar218 * uStack_d0._4_4_;
          auVar42._24_4_ = fVar219 * (float)uStack_c8;
          auVar42._28_4_ = auVar105._28_4_;
          auVar152 = vfmadd231ps_fma(auVar42,auVar8,local_c0);
          auVar152 = vfmadd231ps_fma(ZEXT1632(auVar152),auVar205,local_a0);
          auVar152 = vfmadd231ps_fma(ZEXT1632(auVar152),auVar122,local_80);
          auVar125._0_4_ = fVar128 * fVar128;
          auVar125._4_4_ = fVar127 * fVar127;
          auVar125._8_4_ = fVar107 * fVar107;
          auVar125._12_4_ = fVar108 * fVar108;
          auVar125._16_4_ = fVar109 * fVar109;
          auVar125._20_4_ = fVar110 * fVar110;
          auVar125._28_36_ = auVar189._28_36_;
          auVar125._24_4_ = fVar111 * fVar111;
          auVar16 = vfmadd231ps_fma(auVar125._0_32_,auVar14,auVar14);
          local_520 = ZEXT1632(auVar152);
          auVar181 = vmaxps_avx(ZEXT1632(auVar155),local_520);
          auVar186._0_4_ = auVar181._0_4_ * auVar181._0_4_ * auVar16._0_4_;
          auVar186._4_4_ = auVar181._4_4_ * auVar181._4_4_ * auVar16._4_4_;
          auVar186._8_4_ = auVar181._8_4_ * auVar181._8_4_ * auVar16._8_4_;
          auVar186._12_4_ = auVar181._12_4_ * auVar181._12_4_ * auVar16._12_4_;
          auVar186._16_4_ = auVar181._16_4_ * auVar181._16_4_ * 0.0;
          auVar186._20_4_ = auVar181._20_4_ * auVar181._20_4_ * 0.0;
          auVar186._24_4_ = auVar181._24_4_ * auVar181._24_4_ * 0.0;
          auVar186._28_4_ = 0;
          auVar43._4_4_ = auVar99._4_4_ * auVar99._4_4_;
          auVar43._0_4_ = auVar99._0_4_ * auVar99._0_4_;
          auVar43._8_4_ = auVar99._8_4_ * auVar99._8_4_;
          auVar43._12_4_ = auVar99._12_4_ * auVar99._12_4_;
          auVar43._16_4_ = auVar99._16_4_ * auVar99._16_4_;
          auVar43._20_4_ = auVar99._20_4_ * auVar99._20_4_;
          auVar43._24_4_ = auVar99._24_4_ * auVar99._24_4_;
          auVar43._28_4_ = auVar99._28_4_;
          auVar181 = vcmpps_avx(auVar43,auVar186,2);
          local_3e0 = (int)lVar85;
          auVar187._4_4_ = local_3e0;
          auVar187._0_4_ = local_3e0;
          auVar187._8_4_ = local_3e0;
          auVar187._12_4_ = local_3e0;
          auVar187._16_4_ = local_3e0;
          auVar187._20_4_ = local_3e0;
          auVar187._24_4_ = local_3e0;
          auVar187._28_4_ = local_3e0;
          auVar99 = vpor_avx2(auVar187,_DAT_0205a920);
          auVar19 = vpcmpgtd_avx2(local_540,auVar99);
          auVar99 = auVar19 & auVar181;
          if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar99 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar99 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar99 >> 0x7f,0) == '\0') &&
                (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar99 >> 0xbf,0) == '\0') &&
              (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar99[0x1f]) {
            auVar147 = ZEXT3264(local_6a0);
            auVar189 = ZEXT3264(auVar189._0_32_);
            auVar125 = ZEXT3264(CONCAT428(fVar148,CONCAT424(fVar141,CONCAT420(fVar148,CONCAT416(
                                                  fVar141,CONCAT412(fVar148,CONCAT48(fVar141,uVar89)
                                                                   ))))));
          }
          else {
            _local_560 = vandps_avx(auVar19,auVar181);
            auVar44._4_4_ = (float)local_720._4_4_ * fVar126;
            auVar44._0_4_ = (float)local_720._0_4_ * fVar112;
            auVar44._8_4_ = fStack_718 * fVar209;
            auVar44._12_4_ = fStack_714 * fVar216;
            auVar44._16_4_ = fStack_710 * fVar217;
            auVar44._20_4_ = fStack_70c * fVar218;
            auVar44._24_4_ = fStack_708 * fVar219;
            auVar44._28_4_ = auVar181._28_4_;
            auVar152 = vfmadd213ps_fma(auVar8,_local_700,auVar44);
            auVar152 = vfmadd213ps_fma(auVar205,local_4e0,ZEXT1632(auVar152));
            auVar152 = vfmadd132ps_fma(auVar122,ZEXT1632(auVar152),auVar143);
            auVar45._4_4_ = (float)local_720._4_4_ * auVar77._4_4_;
            auVar45._0_4_ = (float)local_720._0_4_ * auVar77._0_4_;
            auVar45._8_4_ = fStack_718 * auVar77._8_4_;
            auVar45._12_4_ = fStack_714 * auVar77._12_4_;
            auVar45._16_4_ = fStack_710 * auVar77._16_4_;
            auVar45._20_4_ = fStack_70c * auVar77._20_4_;
            auVar45._24_4_ = fStack_708 * auVar77._24_4_;
            auVar45._28_4_ = auVar181._28_4_;
            auVar16 = vfmadd213ps_fma(auVar104,_local_700,auVar45);
            auVar16 = vfmadd213ps_fma(auVar105,local_4e0,ZEXT1632(auVar16));
            auVar105 = *(undefined1 (*) [32])(lVar20 + 0x222cd38 + lVar85 * 4);
            auVar104 = *(undefined1 (*) [32])(lVar20 + 0x222d1bc + lVar85 * 4);
            auVar122 = *(undefined1 (*) [32])(lVar20 + 0x222d640 + lVar85 * 4);
            pfVar3 = (float *)(lVar20 + 0x222dac4 + lVar85 * 4);
            fVar128 = *pfVar3;
            fVar127 = pfVar3[1];
            fVar107 = pfVar3[2];
            fVar108 = pfVar3[3];
            fVar109 = pfVar3[4];
            fVar110 = pfVar3[5];
            fVar111 = pfVar3[6];
            auVar46._4_4_ = fVar127 * fVar190;
            auVar46._0_4_ = fVar128 * fVar183;
            auVar46._8_4_ = fVar107 * fVar191;
            auVar46._12_4_ = fVar108 * fVar192;
            auVar46._16_4_ = fVar109 * fVar193;
            auVar46._20_4_ = fVar110 * fVar194;
            auVar46._24_4_ = fVar111 * fVar195;
            auVar46._28_4_ = local_4e0._28_4_;
            auVar47._4_4_ = fVar127 * fVar148;
            auVar47._0_4_ = fVar128 * fVar141;
            auVar47._8_4_ = fVar107 * fVar141;
            auVar47._12_4_ = fVar108 * fVar148;
            auVar47._16_4_ = fVar109 * fVar141;
            auVar47._20_4_ = fVar110 * fVar148;
            auVar47._24_4_ = fVar111 * fVar141;
            auVar47._28_4_ = *(undefined4 *)(*pauVar2 + 0x1c);
            auVar48._4_4_ = (float)local_720._4_4_ * fVar127;
            auVar48._0_4_ = (float)local_720._0_4_ * fVar128;
            auVar48._8_4_ = fStack_718 * fVar107;
            auVar48._12_4_ = fStack_714 * fVar108;
            auVar48._16_4_ = fStack_710 * fVar109;
            auVar48._20_4_ = fStack_70c * fVar110;
            auVar48._24_4_ = fStack_708 * fVar111;
            auVar48._28_4_ = pfVar3[7];
            auVar93 = vfmadd231ps_fma(auVar46,auVar122,local_6a0);
            auVar92 = vfmadd231ps_fma(auVar47,auVar122,auVar201);
            auVar129 = vfmadd231ps_fma(auVar48,_local_700,auVar122);
            auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar104,auVar213);
            auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar104,local_500);
            auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),local_4e0,auVar104);
            auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar105,auVar185);
            auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar105,local_580);
            auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),auVar105,auVar143);
            pfVar3 = (float *)(lVar20 + 0x222fee4 + lVar85 * 4);
            fVar128 = *pfVar3;
            fVar127 = pfVar3[1];
            fVar107 = pfVar3[2];
            fVar108 = pfVar3[3];
            fVar109 = pfVar3[4];
            fVar110 = pfVar3[5];
            fVar111 = pfVar3[6];
            auVar49._4_4_ = fVar190 * fVar127;
            auVar49._0_4_ = fVar183 * fVar128;
            auVar49._8_4_ = fVar191 * fVar107;
            auVar49._12_4_ = fVar192 * fVar108;
            auVar49._16_4_ = fVar193 * fVar109;
            auVar49._20_4_ = fVar194 * fVar110;
            auVar49._24_4_ = fVar195 * fVar111;
            auVar49._28_4_ = auVar14._28_4_;
            auVar50._4_4_ = fVar148 * fVar127;
            auVar50._0_4_ = fVar141 * fVar128;
            auVar50._8_4_ = fVar141 * fVar107;
            auVar50._12_4_ = fVar148 * fVar108;
            auVar50._16_4_ = fVar141 * fVar109;
            auVar50._20_4_ = fVar148 * fVar110;
            auVar50._24_4_ = fVar141 * fVar111;
            auVar50._28_4_ = auVar106._28_4_;
            auVar51._4_4_ = fVar127 * (float)local_720._4_4_;
            auVar51._0_4_ = fVar128 * (float)local_720._0_4_;
            auVar51._8_4_ = fVar107 * fStack_718;
            auVar51._12_4_ = fVar108 * fStack_714;
            auVar51._16_4_ = fVar109 * fStack_710;
            auVar51._20_4_ = fVar110 * fStack_70c;
            auVar51._24_4_ = fVar111 * fStack_708;
            auVar51._28_4_ = pfVar3[7];
            auVar105 = *(undefined1 (*) [32])(lVar20 + 0x222fa60 + lVar85 * 4);
            auVar115 = vfmadd231ps_fma(auVar49,auVar105,local_6a0);
            auVar91 = vfmadd231ps_fma(auVar50,auVar105,auVar201);
            auVar116 = vfmadd231ps_fma(auVar51,_local_700,auVar105);
            auVar105 = *(undefined1 (*) [32])(lVar20 + 0x222f5dc + lVar85 * 4);
            auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar105,auVar213);
            auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar105,local_500);
            auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar105,local_4e0);
            auVar105 = *(undefined1 (*) [32])(lVar20 + 0x222f158 + lVar85 * 4);
            auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar105,auVar185);
            auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar105,local_580);
            auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar143,auVar105);
            auVar188._8_4_ = 0x7fffffff;
            auVar188._0_8_ = 0x7fffffff7fffffff;
            auVar188._12_4_ = 0x7fffffff;
            auVar188._16_4_ = 0x7fffffff;
            auVar188._20_4_ = 0x7fffffff;
            auVar188._24_4_ = 0x7fffffff;
            auVar188._28_4_ = 0x7fffffff;
            auVar105 = vandps_avx(ZEXT1632(auVar93),auVar188);
            auVar104 = vandps_avx(ZEXT1632(auVar92),auVar188);
            auVar104 = vmaxps_avx(auVar105,auVar104);
            auVar105 = vandps_avx(ZEXT1632(auVar129),auVar188);
            auVar105 = vmaxps_avx(auVar104,auVar105);
            auVar105 = vcmpps_avx(auVar105,_local_480,1);
            auVar122 = vblendvps_avx(ZEXT1632(auVar93),auVar14,auVar105);
            auVar205 = vblendvps_avx(ZEXT1632(auVar92),auVar106,auVar105);
            auVar105 = vandps_avx(ZEXT1632(auVar115),auVar188);
            auVar104 = vandps_avx(ZEXT1632(auVar91),auVar188);
            auVar104 = vmaxps_avx(auVar105,auVar104);
            auVar105 = vandps_avx(auVar188,ZEXT1632(auVar116));
            auVar105 = vmaxps_avx(auVar104,auVar105);
            auVar104 = vcmpps_avx(auVar105,_local_480,1);
            auVar105 = vblendvps_avx(ZEXT1632(auVar115),auVar14,auVar104);
            auVar104 = vblendvps_avx(ZEXT1632(auVar91),auVar106,auVar104);
            auVar16 = vfmadd213ps_fma(auVar97,auVar143,ZEXT1632(auVar16));
            auVar93 = vfmadd213ps_fma(auVar122,auVar122,ZEXT832(0) << 0x20);
            auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar205,auVar205);
            auVar97 = vrsqrtps_avx(ZEXT1632(auVar93));
            fVar128 = auVar97._0_4_;
            fVar127 = auVar97._4_4_;
            fVar107 = auVar97._8_4_;
            fVar108 = auVar97._12_4_;
            fVar109 = auVar97._16_4_;
            fVar110 = auVar97._20_4_;
            fVar111 = auVar97._24_4_;
            auVar52._4_4_ = fVar127 * fVar127 * fVar127 * auVar93._4_4_ * -0.5;
            auVar52._0_4_ = fVar128 * fVar128 * fVar128 * auVar93._0_4_ * -0.5;
            auVar52._8_4_ = fVar107 * fVar107 * fVar107 * auVar93._8_4_ * -0.5;
            auVar52._12_4_ = fVar108 * fVar108 * fVar108 * auVar93._12_4_ * -0.5;
            auVar52._16_4_ = fVar109 * fVar109 * fVar109 * -0.0;
            auVar52._20_4_ = fVar110 * fVar110 * fVar110 * -0.0;
            auVar52._24_4_ = fVar111 * fVar111 * fVar111 * -0.0;
            auVar52._28_4_ = 0;
            auVar215._8_4_ = 0x3fc00000;
            auVar215._0_8_ = 0x3fc000003fc00000;
            auVar215._12_4_ = 0x3fc00000;
            auVar215._16_4_ = 0x3fc00000;
            auVar215._20_4_ = 0x3fc00000;
            auVar215._24_4_ = 0x3fc00000;
            auVar215._28_4_ = 0x3fc00000;
            auVar93 = vfmadd231ps_fma(auVar52,auVar215,auVar97);
            fVar128 = auVar93._0_4_;
            fVar127 = auVar93._4_4_;
            auVar53._4_4_ = auVar205._4_4_ * fVar127;
            auVar53._0_4_ = auVar205._0_4_ * fVar128;
            fVar107 = auVar93._8_4_;
            auVar53._8_4_ = auVar205._8_4_ * fVar107;
            fVar108 = auVar93._12_4_;
            auVar53._12_4_ = auVar205._12_4_ * fVar108;
            auVar53._16_4_ = auVar205._16_4_ * 0.0;
            auVar53._20_4_ = auVar205._20_4_ * 0.0;
            auVar53._24_4_ = auVar205._24_4_ * 0.0;
            auVar53._28_4_ = auVar97._28_4_;
            auVar54._4_4_ = fVar127 * -auVar122._4_4_;
            auVar54._0_4_ = fVar128 * -auVar122._0_4_;
            auVar54._8_4_ = fVar107 * -auVar122._8_4_;
            auVar54._12_4_ = fVar108 * -auVar122._12_4_;
            auVar54._16_4_ = -auVar122._16_4_ * 0.0;
            auVar54._20_4_ = -auVar122._20_4_ * 0.0;
            auVar54._24_4_ = -auVar122._24_4_ * 0.0;
            auVar54._28_4_ = auVar205._28_4_;
            auVar93 = vfmadd213ps_fma(auVar105,auVar105,ZEXT832(0) << 0x20);
            auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar104,auVar104);
            auVar97 = vrsqrtps_avx(ZEXT1632(auVar93));
            auVar55._28_4_ = auVar15._4_4_;
            auVar55._0_28_ =
                 ZEXT1628(CONCAT412(fVar108 * 0.0,
                                    CONCAT48(fVar107 * 0.0,CONCAT44(fVar127 * 0.0,fVar128 * 0.0))));
            fVar128 = auVar97._0_4_;
            fVar127 = auVar97._4_4_;
            fVar107 = auVar97._8_4_;
            fVar108 = auVar97._12_4_;
            fVar109 = auVar97._16_4_;
            fVar110 = auVar97._20_4_;
            fVar111 = auVar97._24_4_;
            auVar56._4_4_ = fVar127 * fVar127 * fVar127 * auVar93._4_4_ * -0.5;
            auVar56._0_4_ = fVar128 * fVar128 * fVar128 * auVar93._0_4_ * -0.5;
            auVar56._8_4_ = fVar107 * fVar107 * fVar107 * auVar93._8_4_ * -0.5;
            auVar56._12_4_ = fVar108 * fVar108 * fVar108 * auVar93._12_4_ * -0.5;
            auVar56._16_4_ = fVar109 * fVar109 * fVar109 * -0.0;
            auVar56._20_4_ = fVar110 * fVar110 * fVar110 * -0.0;
            auVar56._24_4_ = fVar111 * fVar111 * fVar111 * -0.0;
            auVar56._28_4_ = 0;
            auVar93 = vfmadd231ps_fma(auVar56,auVar215,auVar97);
            fVar128 = auVar93._0_4_;
            fVar127 = auVar93._4_4_;
            auVar57._4_4_ = auVar104._4_4_ * fVar127;
            auVar57._0_4_ = auVar104._0_4_ * fVar128;
            fVar107 = auVar93._8_4_;
            auVar57._8_4_ = auVar104._8_4_ * fVar107;
            fVar108 = auVar93._12_4_;
            auVar57._12_4_ = auVar104._12_4_ * fVar108;
            auVar57._16_4_ = auVar104._16_4_ * 0.0;
            auVar57._20_4_ = auVar104._20_4_ * 0.0;
            auVar57._24_4_ = auVar104._24_4_ * 0.0;
            auVar57._28_4_ = 0;
            auVar58._4_4_ = fVar127 * -auVar105._4_4_;
            auVar58._0_4_ = fVar128 * -auVar105._0_4_;
            auVar58._8_4_ = fVar107 * -auVar105._8_4_;
            auVar58._12_4_ = fVar108 * -auVar105._12_4_;
            auVar58._16_4_ = -auVar105._16_4_ * 0.0;
            auVar58._20_4_ = -auVar105._20_4_ * 0.0;
            auVar58._24_4_ = -auVar105._24_4_ * 0.0;
            auVar58._28_4_ = auVar97._28_4_;
            auVar59._28_4_ = 0xbf000000;
            auVar59._0_28_ =
                 ZEXT1628(CONCAT412(fVar108 * 0.0,
                                    CONCAT48(fVar107 * 0.0,CONCAT44(fVar127 * 0.0,fVar128 * 0.0))));
            auVar93 = vfmadd213ps_fma(auVar53,ZEXT1632(auVar155),_local_5c0);
            auVar97 = ZEXT1632(auVar155);
            auVar92 = vfmadd213ps_fma(auVar54,auVar97,local_5a0);
            auVar129 = vfmadd213ps_fma(auVar55,auVar97,ZEXT1632(auVar16));
            auVar116 = vfnmadd213ps_fma(auVar53,auVar97,_local_5c0);
            auVar115 = vfmadd213ps_fma(auVar57,local_520,auVar170);
            auVar142 = vfnmadd213ps_fma(auVar54,auVar97,local_5a0);
            auVar91 = vfmadd213ps_fma(auVar58,local_520,auVar138);
            auVar98 = ZEXT1632(auVar155);
            auVar155 = vfnmadd231ps_fma(ZEXT1632(auVar16),auVar98,auVar55);
            auVar16 = vfmadd213ps_fma(auVar59,local_520,ZEXT1632(auVar152));
            auVar150 = vfnmadd213ps_fma(auVar57,local_520,auVar170);
            auVar90 = vfnmadd213ps_fma(auVar58,local_520,auVar138);
            auVar114 = vfnmadd231ps_fma(ZEXT1632(auVar152),local_520,auVar59);
            auVar97 = vsubps_avx(ZEXT1632(auVar91),ZEXT1632(auVar142));
            auVar105 = vsubps_avx(ZEXT1632(auVar16),ZEXT1632(auVar155));
            auVar172._0_4_ = auVar97._0_4_ * auVar155._0_4_;
            auVar172._4_4_ = auVar97._4_4_ * auVar155._4_4_;
            auVar172._8_4_ = auVar97._8_4_ * auVar155._8_4_;
            auVar172._12_4_ = auVar97._12_4_ * auVar155._12_4_;
            auVar172._16_4_ = auVar97._16_4_ * 0.0;
            auVar172._20_4_ = auVar97._20_4_ * 0.0;
            auVar172._24_4_ = auVar97._24_4_ * 0.0;
            auVar172._28_4_ = 0;
            auVar152 = vfmsub231ps_fma(auVar172,ZEXT1632(auVar142),auVar105);
            auVar60._4_4_ = auVar116._4_4_ * auVar105._4_4_;
            auVar60._0_4_ = auVar116._0_4_ * auVar105._0_4_;
            auVar60._8_4_ = auVar116._8_4_ * auVar105._8_4_;
            auVar60._12_4_ = auVar116._12_4_ * auVar105._12_4_;
            auVar60._16_4_ = auVar105._16_4_ * 0.0;
            auVar60._20_4_ = auVar105._20_4_ * 0.0;
            auVar60._24_4_ = auVar105._24_4_ * 0.0;
            auVar60._28_4_ = auVar105._28_4_;
            auVar181 = ZEXT1632(auVar116);
            auVar105 = vsubps_avx(ZEXT1632(auVar115),auVar181);
            auVar106 = ZEXT1632(auVar155);
            auVar155 = vfmsub231ps_fma(auVar60,auVar106,auVar105);
            auVar61._4_4_ = auVar142._4_4_ * auVar105._4_4_;
            auVar61._0_4_ = auVar142._0_4_ * auVar105._0_4_;
            auVar61._8_4_ = auVar142._8_4_ * auVar105._8_4_;
            auVar61._12_4_ = auVar142._12_4_ * auVar105._12_4_;
            auVar61._16_4_ = auVar105._16_4_ * 0.0;
            auVar61._20_4_ = auVar105._20_4_ * 0.0;
            auVar61._24_4_ = auVar105._24_4_ * 0.0;
            auVar61._28_4_ = auVar105._28_4_;
            auVar116 = vfmsub231ps_fma(auVar61,auVar181,auVar97);
            auVar155 = vfmadd231ps_fma(ZEXT1632(auVar116),ZEXT832(0) << 0x20,ZEXT1632(auVar155));
            auVar155 = vfmadd231ps_fma(ZEXT1632(auVar155),ZEXT832(0) << 0x20,ZEXT1632(auVar152));
            auVar99 = vcmpps_avx(ZEXT1632(auVar155),ZEXT832(0) << 0x20,2);
            auVar97 = vblendvps_avx(ZEXT1632(auVar150),ZEXT1632(auVar93),auVar99);
            auVar105 = vblendvps_avx(ZEXT1632(auVar90),ZEXT1632(auVar92),auVar99);
            auVar104 = vblendvps_avx(ZEXT1632(auVar114),ZEXT1632(auVar129),auVar99);
            auVar122 = vblendvps_avx(auVar181,ZEXT1632(auVar115),auVar99);
            auVar205 = vblendvps_avx(ZEXT1632(auVar142),ZEXT1632(auVar91),auVar99);
            auVar8 = vblendvps_avx(auVar106,ZEXT1632(auVar16),auVar99);
            auVar181 = vblendvps_avx(ZEXT1632(auVar115),auVar181,auVar99);
            auVar14 = vblendvps_avx(ZEXT1632(auVar91),ZEXT1632(auVar142),auVar99);
            auVar155 = vpackssdw_avx(local_560._0_16_,local_560._16_16_);
            auVar106 = vblendvps_avx(ZEXT1632(auVar16),auVar106,auVar99);
            auVar181 = vsubps_avx(auVar181,auVar97);
            auVar14 = vsubps_avx(auVar14,auVar105);
            auVar19 = vsubps_avx(auVar106,auVar104);
            auVar207 = ZEXT3264(auVar19);
            auVar138 = vsubps_avx(auVar97,auVar122);
            auVar170 = vsubps_avx(auVar105,auVar205);
            auVar18 = vsubps_avx(auVar104,auVar8);
            auVar164._0_4_ = auVar19._0_4_ * auVar97._0_4_;
            auVar164._4_4_ = auVar19._4_4_ * auVar97._4_4_;
            auVar164._8_4_ = auVar19._8_4_ * auVar97._8_4_;
            auVar164._12_4_ = auVar19._12_4_ * auVar97._12_4_;
            auVar164._16_4_ = auVar19._16_4_ * auVar97._16_4_;
            auVar164._20_4_ = auVar19._20_4_ * auVar97._20_4_;
            auVar164._24_4_ = auVar19._24_4_ * auVar97._24_4_;
            auVar164._28_4_ = 0;
            auVar152 = vfmsub231ps_fma(auVar164,auVar104,auVar181);
            auVar62._4_4_ = auVar181._4_4_ * auVar105._4_4_;
            auVar62._0_4_ = auVar181._0_4_ * auVar105._0_4_;
            auVar62._8_4_ = auVar181._8_4_ * auVar105._8_4_;
            auVar62._12_4_ = auVar181._12_4_ * auVar105._12_4_;
            auVar62._16_4_ = auVar181._16_4_ * auVar105._16_4_;
            auVar62._20_4_ = auVar181._20_4_ * auVar105._20_4_;
            auVar62._24_4_ = auVar181._24_4_ * auVar105._24_4_;
            auVar62._28_4_ = auVar106._28_4_;
            auVar16 = vfmsub231ps_fma(auVar62,auVar97,auVar14);
            auVar152 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT1632(auVar152),_DAT_02020f00);
            auVar165._0_4_ = auVar14._0_4_ * auVar104._0_4_;
            auVar165._4_4_ = auVar14._4_4_ * auVar104._4_4_;
            auVar165._8_4_ = auVar14._8_4_ * auVar104._8_4_;
            auVar165._12_4_ = auVar14._12_4_ * auVar104._12_4_;
            auVar165._16_4_ = auVar14._16_4_ * auVar104._16_4_;
            auVar165._20_4_ = auVar14._20_4_ * auVar104._20_4_;
            auVar165._24_4_ = auVar14._24_4_ * auVar104._24_4_;
            auVar165._28_4_ = 0;
            auVar16 = vfmsub231ps_fma(auVar165,auVar105,auVar19);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar152),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
            auVar166._0_4_ = auVar18._0_4_ * auVar122._0_4_;
            auVar166._4_4_ = auVar18._4_4_ * auVar122._4_4_;
            auVar166._8_4_ = auVar18._8_4_ * auVar122._8_4_;
            auVar166._12_4_ = auVar18._12_4_ * auVar122._12_4_;
            auVar166._16_4_ = auVar18._16_4_ * auVar122._16_4_;
            auVar166._20_4_ = auVar18._20_4_ * auVar122._20_4_;
            auVar166._24_4_ = auVar18._24_4_ * auVar122._24_4_;
            auVar166._28_4_ = 0;
            auVar152 = vfmsub231ps_fma(auVar166,auVar138,auVar8);
            auVar63._4_4_ = auVar170._4_4_ * auVar8._4_4_;
            auVar63._0_4_ = auVar170._0_4_ * auVar8._0_4_;
            auVar63._8_4_ = auVar170._8_4_ * auVar8._8_4_;
            auVar63._12_4_ = auVar170._12_4_ * auVar8._12_4_;
            auVar63._16_4_ = auVar170._16_4_ * auVar8._16_4_;
            auVar63._20_4_ = auVar170._20_4_ * auVar8._20_4_;
            auVar63._24_4_ = auVar170._24_4_ * auVar8._24_4_;
            auVar63._28_4_ = auVar8._28_4_;
            auVar93 = vfmsub231ps_fma(auVar63,auVar205,auVar18);
            auVar64._4_4_ = auVar138._4_4_ * auVar205._4_4_;
            auVar64._0_4_ = auVar138._0_4_ * auVar205._0_4_;
            auVar64._8_4_ = auVar138._8_4_ * auVar205._8_4_;
            auVar64._12_4_ = auVar138._12_4_ * auVar205._12_4_;
            auVar64._16_4_ = auVar138._16_4_ * auVar205._16_4_;
            auVar64._20_4_ = auVar138._20_4_ * auVar205._20_4_;
            auVar64._24_4_ = auVar138._24_4_ * auVar205._24_4_;
            auVar64._28_4_ = auVar205._28_4_;
            auVar92 = vfmsub231ps_fma(auVar64,auVar170,auVar122);
            auVar152 = vfmadd231ps_fma(ZEXT1632(auVar92),ZEXT832(0) << 0x20,ZEXT1632(auVar152));
            auVar93 = vfmadd231ps_fma(ZEXT1632(auVar152),ZEXT832(0) << 0x20,ZEXT1632(auVar93));
            auVar122 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(auVar93));
            auVar122 = vcmpps_avx(auVar122,ZEXT832(0) << 0x20,2);
            auVar152 = vpackssdw_avx(auVar122._0_16_,auVar122._16_16_);
            auVar152 = vpand_avx(auVar152,auVar155);
            auVar122 = vpmovsxwd_avx2(auVar152);
            auVar167 = ZEXT3264(auVar122);
            if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar122 >> 0x7f,0) == '\0') &&
                  (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar122 >> 0xbf,0) == '\0') &&
                (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar122[0x1f]) {
LAB_0167b57a:
              auVar146._8_8_ = uStack_5f8;
              auVar146._0_8_ = local_600;
              auVar146._16_8_ = uStack_5f0;
              auVar146._24_8_ = uStack_5e8;
            }
            else {
              auVar65._4_4_ = auVar14._4_4_ * auVar18._4_4_;
              auVar65._0_4_ = auVar14._0_4_ * auVar18._0_4_;
              auVar65._8_4_ = auVar14._8_4_ * auVar18._8_4_;
              auVar65._12_4_ = auVar14._12_4_ * auVar18._12_4_;
              auVar65._16_4_ = auVar14._16_4_ * auVar18._16_4_;
              auVar65._20_4_ = auVar14._20_4_ * auVar18._20_4_;
              auVar65._24_4_ = auVar14._24_4_ * auVar18._24_4_;
              auVar65._28_4_ = auVar122._28_4_;
              auVar91 = vfmsub231ps_fma(auVar65,auVar170,auVar19);
              auVar173._0_4_ = auVar19._0_4_ * auVar138._0_4_;
              auVar173._4_4_ = auVar19._4_4_ * auVar138._4_4_;
              auVar173._8_4_ = auVar19._8_4_ * auVar138._8_4_;
              auVar173._12_4_ = auVar19._12_4_ * auVar138._12_4_;
              auVar173._16_4_ = auVar19._16_4_ * auVar138._16_4_;
              auVar173._20_4_ = auVar19._20_4_ * auVar138._20_4_;
              auVar173._24_4_ = auVar19._24_4_ * auVar138._24_4_;
              auVar173._28_4_ = 0;
              auVar115 = vfmsub231ps_fma(auVar173,auVar181,auVar18);
              auVar66._4_4_ = auVar181._4_4_ * auVar170._4_4_;
              auVar66._0_4_ = auVar181._0_4_ * auVar170._0_4_;
              auVar66._8_4_ = auVar181._8_4_ * auVar170._8_4_;
              auVar66._12_4_ = auVar181._12_4_ * auVar170._12_4_;
              auVar66._16_4_ = auVar181._16_4_ * auVar170._16_4_;
              auVar66._20_4_ = auVar181._20_4_ * auVar170._20_4_;
              auVar66._24_4_ = auVar181._24_4_ * auVar170._24_4_;
              auVar66._28_4_ = auVar170._28_4_;
              auVar116 = vfmsub231ps_fma(auVar66,auVar138,auVar14);
              auVar92 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar115),ZEXT1632(auVar116));
              auVar129 = vfmadd231ps_fma(ZEXT1632(auVar92),ZEXT1632(auVar91),ZEXT832(0) << 0x20);
              auVar122 = vrcpps_avx(ZEXT1632(auVar129));
              auVar206._8_4_ = 0x3f800000;
              auVar206._0_8_ = &DAT_3f8000003f800000;
              auVar206._12_4_ = 0x3f800000;
              auVar206._16_4_ = 0x3f800000;
              auVar206._20_4_ = 0x3f800000;
              auVar206._24_4_ = 0x3f800000;
              auVar206._28_4_ = 0x3f800000;
              auVar207 = ZEXT3264(auVar206);
              auVar92 = vfnmadd213ps_fma(auVar122,ZEXT1632(auVar129),auVar206);
              auVar92 = vfmadd132ps_fma(ZEXT1632(auVar92),auVar122,auVar122);
              auVar144._0_4_ = auVar116._0_4_ * auVar104._0_4_;
              auVar144._4_4_ = auVar116._4_4_ * auVar104._4_4_;
              auVar144._8_4_ = auVar116._8_4_ * auVar104._8_4_;
              auVar144._12_4_ = auVar116._12_4_ * auVar104._12_4_;
              auVar144._16_4_ = auVar104._16_4_ * 0.0;
              auVar144._20_4_ = auVar104._20_4_ * 0.0;
              auVar144._24_4_ = auVar104._24_4_ * 0.0;
              auVar144._28_4_ = 0;
              auVar115 = vfmadd231ps_fma(auVar144,ZEXT1632(auVar115),auVar105);
              auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar97,ZEXT1632(auVar91));
              fVar128 = auVar92._0_4_;
              fVar127 = auVar92._4_4_;
              fVar107 = auVar92._8_4_;
              fVar108 = auVar92._12_4_;
              auVar104 = ZEXT1632(CONCAT412(fVar108 * auVar115._12_4_,
                                            CONCAT48(fVar107 * auVar115._8_4_,
                                                     CONCAT44(fVar127 * auVar115._4_4_,
                                                              fVar128 * auVar115._0_4_))));
              auVar167 = ZEXT3264(auVar104);
              uVar88 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar145._4_4_ = uVar88;
              auVar145._0_4_ = uVar88;
              auVar145._8_4_ = uVar88;
              auVar145._12_4_ = uVar88;
              auVar145._16_4_ = uVar88;
              auVar145._20_4_ = uVar88;
              auVar145._24_4_ = uVar88;
              auVar145._28_4_ = uVar88;
              auVar76._4_4_ = uStack_5dc;
              auVar76._0_4_ = local_5e0;
              auVar76._8_4_ = uStack_5d8;
              auVar76._12_4_ = uStack_5d4;
              auVar76._16_4_ = uStack_5d0;
              auVar76._20_4_ = uStack_5cc;
              auVar76._24_4_ = uStack_5c8;
              auVar76._28_4_ = uStack_5c4;
              auVar97 = vcmpps_avx(auVar76,auVar104,2);
              auVar105 = vcmpps_avx(auVar104,auVar145,2);
              auVar97 = vandps_avx(auVar105,auVar97);
              auVar92 = vpackssdw_avx(auVar97._0_16_,auVar97._16_16_);
              auVar152 = vpand_avx(auVar152,auVar92);
              auVar97 = vpmovsxwd_avx2(auVar152);
              if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar97 >> 0x7f,0) == '\0') &&
                    (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar97 >> 0xbf,0) == '\0') &&
                  (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar97[0x1f]) goto LAB_0167b57a;
              auVar97 = vcmpps_avx(ZEXT1632(auVar129),ZEXT832(0) << 0x20,4);
              auVar92 = vpackssdw_avx(auVar97._0_16_,auVar97._16_16_);
              auVar152 = vpand_avx(auVar152,auVar92);
              auVar97 = vpmovsxwd_avx2(auVar152);
              auVar146._8_8_ = uStack_5f8;
              auVar146._0_8_ = local_600;
              auVar146._16_8_ = uStack_5f0;
              auVar146._24_8_ = uStack_5e8;
              if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar97 >> 0x7f,0) != '\0') ||
                    (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar97 >> 0xbf,0) != '\0') ||
                  (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar97[0x1f] < '\0') {
                auVar122 = ZEXT1632(CONCAT412(fVar108 * auVar16._12_4_,
                                              CONCAT48(fVar107 * auVar16._8_4_,
                                                       CONCAT44(fVar127 * auVar16._4_4_,
                                                                fVar128 * auVar16._0_4_))));
                auVar67._28_4_ = SUB84(uStack_5e8,4);
                auVar67._0_28_ =
                     ZEXT1628(CONCAT412(fVar108 * auVar93._12_4_,
                                        CONCAT48(fVar107 * auVar93._8_4_,
                                                 CONCAT44(fVar127 * auVar93._4_4_,
                                                          fVar128 * auVar93._0_4_))));
                auVar182._8_4_ = 0x3f800000;
                auVar182._0_8_ = &DAT_3f8000003f800000;
                auVar182._12_4_ = 0x3f800000;
                auVar182._16_4_ = 0x3f800000;
                auVar182._20_4_ = 0x3f800000;
                auVar182._24_4_ = 0x3f800000;
                auVar182._28_4_ = 0x3f800000;
                auVar105 = vsubps_avx(auVar182,auVar122);
                _local_2e0 = vblendvps_avx(auVar105,auVar122,auVar99);
                auVar105 = vsubps_avx(auVar182,auVar67);
                local_4c0 = vblendvps_avx(auVar105,auVar67,auVar99);
                local_300 = auVar104;
                auVar146 = auVar97;
              }
            }
            auVar189 = ZEXT3264(CONCAT428(fStack_6c4,
                                          CONCAT424(fStack_6c8,
                                                    CONCAT420(fStack_6cc,
                                                              CONCAT416(fStack_6d0,
                                                                        CONCAT412(fStack_6d4,
                                                                                  CONCAT48(
                                                  fStack_6d8,CONCAT44(fStack_6dc,local_6e0))))))));
            if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar146 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar146 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar146 >> 0x7f,0) == '\0') &&
                  (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar146 >> 0xbf,0) == '\0') &&
                (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar146[0x1f]) {
              auVar147 = ZEXT3264(local_6a0);
              auVar125 = ZEXT3264(CONCAT428(fVar148,CONCAT424(fVar141,CONCAT420(fVar148,CONCAT416(
                                                  fVar141,CONCAT412(fVar148,CONCAT48(fVar141,uVar89)
                                                                   ))))));
            }
            else {
              auVar97 = vsubps_avx(local_520,auVar98);
              auVar152 = vfmadd213ps_fma(auVar97,_local_2e0,auVar98);
              fVar128 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
              auVar68._4_4_ = (auVar152._4_4_ + auVar152._4_4_) * fVar128;
              auVar68._0_4_ = (auVar152._0_4_ + auVar152._0_4_) * fVar128;
              auVar68._8_4_ = (auVar152._8_4_ + auVar152._8_4_) * fVar128;
              auVar68._12_4_ = (auVar152._12_4_ + auVar152._12_4_) * fVar128;
              auVar68._16_4_ = fVar128 * 0.0;
              auVar68._20_4_ = fVar128 * 0.0;
              auVar68._24_4_ = fVar128 * 0.0;
              auVar68._28_4_ = fVar128;
              auVar167 = ZEXT3264(local_300);
              auVar97 = vcmpps_avx(local_300,auVar68,6);
              auVar105 = auVar146 & auVar97;
              if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar105 >> 0x7f,0) == '\0') &&
                    (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar105 >> 0xbf,0) == '\0') &&
                  (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar105[0x1f]) {
                auVar125 = ZEXT3264(CONCAT428(fVar148,CONCAT424(fVar141,CONCAT420(fVar148,CONCAT416(
                                                  fVar141,CONCAT412(fVar148,CONCAT48(fVar141,uVar89)
                                                                   ))))));
              }
              else {
                local_380 = vandps_avx(auVar97,auVar146);
                auVar124._8_4_ = 0xbf800000;
                auVar124._0_8_ = 0xbf800000bf800000;
                auVar124._12_4_ = 0xbf800000;
                auVar124._16_4_ = 0xbf800000;
                auVar124._20_4_ = 0xbf800000;
                auVar124._24_4_ = 0xbf800000;
                auVar124._28_4_ = 0xbf800000;
                auVar139._8_4_ = 0x40000000;
                auVar139._0_8_ = 0x4000000040000000;
                auVar139._12_4_ = 0x40000000;
                auVar139._16_4_ = 0x40000000;
                auVar139._20_4_ = 0x40000000;
                auVar139._24_4_ = 0x40000000;
                auVar139._28_4_ = 0x40000000;
                auVar152 = vfmadd213ps_fma(local_4c0,auVar139,auVar124);
                local_440 = _local_2e0;
                local_420 = ZEXT1632(auVar152);
                local_400 = local_300;
                local_3c0 = local_610._0_8_;
                uStack_3b8 = local_610._8_8_;
                local_3b0 = local_620._0_8_;
                uStack_3a8 = local_620._8_8_;
                local_3a0 = local_630._0_8_;
                uStack_398 = local_630._8_8_;
                pGVar10 = (context->scene->geometries).items[uVar82].ptr;
                local_4c0 = local_420;
                if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  bVar84 = 0;
                  auVar125 = ZEXT3264(CONCAT428(fVar148,CONCAT424(fVar141,CONCAT420(fVar148,
                                                  CONCAT416(fVar141,CONCAT412(fVar148,CONCAT48(
                                                  fVar141,uVar89)))))));
                }
                else {
                  auVar125 = ZEXT3264(CONCAT428(fVar148,CONCAT424(fVar141,CONCAT420(fVar148,
                                                  CONCAT416(fVar141,CONCAT412(fVar148,CONCAT48(
                                                  fVar141,uVar89)))))));
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (bVar84 = 1, pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar128 = (float)local_3e0;
                    local_360[0] = (fVar128 + (float)local_2e0._0_4_ + 0.0) * local_160;
                    local_360[1] = (fVar128 + (float)local_2e0._4_4_ + 1.0) * fStack_15c;
                    local_360[2] = (fVar128 + fStack_2d8 + 2.0) * fStack_158;
                    local_360[3] = (fVar128 + fStack_2d4 + 3.0) * fStack_154;
                    fStack_350 = (fVar128 + fStack_2d0 + 4.0) * fStack_150;
                    fStack_34c = (fVar128 + fStack_2cc + 5.0) * fStack_14c;
                    fStack_348 = (fVar128 + fStack_2c8 + 6.0) * fStack_148;
                    fStack_344 = fVar128 + fStack_2c4 + 7.0;
                    local_4c0._0_8_ = auVar152._0_8_;
                    local_4c0._8_8_ = auVar152._8_8_;
                    local_340 = local_4c0._0_8_;
                    uStack_338 = local_4c0._8_8_;
                    uStack_330 = 0;
                    uStack_328 = 0;
                    local_320 = local_300._0_8_;
                    uStack_318 = local_300._8_8_;
                    uStack_310 = local_300._16_8_;
                    uStack_308 = local_300._24_8_;
                    uVar80 = vmovmskps_avx(local_380);
                    local_6c0 = ZEXT1632(CONCAT124(auVar17._4_12_,
                                                   (int)CONCAT71((int7)((ulong)context >> 8),
                                                                 uVar80 != 0)));
                    if (uVar80 != 0) {
                      lVar21 = 0;
                      local_8c0 = (ulong)(uVar80 & 0xff);
                      for (uVar81 = local_8c0; (uVar81 & 1) == 0;
                          uVar81 = uVar81 >> 1 | 0x8000000000000000) {
                        lVar21 = lVar21 + 1;
                      }
                      local_920 = ZEXT1632(CONCAT88(auVar155._8_8_,lVar21));
                      local_680 = ZEXT1632(local_610);
                      local_5a0 = ZEXT1632(local_620);
                      _local_5c0 = ZEXT1632(local_630);
                      local_3dc = iVar79;
                      local_3d0 = uVar71;
                      uStack_3c8 = uVar72;
                      do {
                        uVar88 = *(undefined4 *)(ray + k * 4 + 0x100);
                        fVar128 = local_360[local_920._0_8_];
                        auVar96._4_4_ = fVar128;
                        auVar96._0_4_ = fVar128;
                        auVar96._8_4_ = fVar128;
                        auVar96._12_4_ = fVar128;
                        local_220._16_4_ = fVar128;
                        local_220._0_16_ = auVar96;
                        local_220._20_4_ = fVar128;
                        local_220._24_4_ = fVar128;
                        local_220._28_4_ = fVar128;
                        local_200._4_4_ = *(undefined4 *)((long)&local_340 + local_920._0_8_ * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)((long)&local_320 + local_920._0_8_ * 4);
                        fVar107 = 1.0 - fVar128;
                        auVar155 = ZEXT416((uint)(fVar128 * fVar107 * 4.0));
                        auVar16 = vfnmsub213ss_fma(auVar96,auVar96,auVar155);
                        auVar167 = ZEXT1664(auVar16);
                        auVar155 = vfmadd213ss_fma(ZEXT416((uint)fVar107),ZEXT416((uint)fVar107),
                                                   auVar155);
                        fVar127 = auVar155._0_4_ * 0.5;
                        fVar128 = fVar128 * fVar128 * 0.5;
                        auVar156._0_4_ = fVar128 * (float)local_5c0._0_4_;
                        auVar156._4_4_ = fVar128 * (float)local_5c0._4_4_;
                        auVar156._8_4_ = fVar128 * fStack_5b8;
                        auVar156._12_4_ = fVar128 * fStack_5b4;
                        auVar132._4_4_ = fVar127;
                        auVar132._0_4_ = fVar127;
                        auVar132._8_4_ = fVar127;
                        auVar132._12_4_ = fVar127;
                        auVar155 = vfmadd132ps_fma(auVar132,auVar156,local_5a0._0_16_);
                        fVar128 = auVar16._0_4_ * 0.5;
                        auVar157._4_4_ = fVar128;
                        auVar157._0_4_ = fVar128;
                        auVar157._8_4_ = fVar128;
                        auVar157._12_4_ = fVar128;
                        auVar155 = vfmadd132ps_fma(auVar157,auVar155,local_680._0_16_);
                        local_750.context = context->user;
                        fVar128 = fVar107 * -fVar107 * 0.5;
                        auVar133._4_4_ = fVar128;
                        auVar133._0_4_ = fVar128;
                        auVar133._8_4_ = fVar128;
                        auVar133._12_4_ = fVar128;
                        auVar152 = vfmadd132ps_fma(auVar133,auVar155,auVar13);
                        local_280 = auVar152._0_4_;
                        uStack_27c = local_280;
                        uStack_278 = local_280;
                        uStack_274 = local_280;
                        uStack_270 = local_280;
                        uStack_26c = local_280;
                        uStack_268 = local_280;
                        uStack_264 = local_280;
                        auVar155 = vmovshdup_avx(auVar152);
                        local_260 = auVar155._0_8_;
                        uStack_258 = local_260;
                        uStack_250 = local_260;
                        uStack_248 = local_260;
                        auVar155 = vshufps_avx(auVar152,auVar152,0xaa);
                        local_240 = auVar155._0_8_;
                        uStack_238 = local_240;
                        uStack_230 = local_240;
                        uStack_228 = local_240;
                        local_200._0_4_ = local_200._4_4_;
                        local_200._8_4_ = local_200._4_4_;
                        local_200._12_4_ = local_200._4_4_;
                        local_200._16_4_ = local_200._4_4_;
                        local_200._20_4_ = local_200._4_4_;
                        local_200._24_4_ = local_200._4_4_;
                        local_200._28_4_ = local_200._4_4_;
                        local_1e0 = CONCAT44(uStack_13c,local_140);
                        uStack_1d8 = CONCAT44(uStack_134,uStack_138);
                        uStack_1d0 = CONCAT44(uStack_12c,uStack_130);
                        uStack_1c8 = CONCAT44(uStack_124,uStack_128);
                        local_1c0._4_4_ = uStack_11c;
                        local_1c0._0_4_ = local_120;
                        local_1c0._8_4_ = uStack_118;
                        local_1c0._12_4_ = uStack_114;
                        local_1c0._16_4_ = uStack_110;
                        local_1c0._20_4_ = uStack_10c;
                        local_1c0._24_4_ = uStack_108;
                        local_1c0._28_4_ = uStack_104;
                        vpcmpeqd_avx2(local_1c0,local_1c0);
                        local_1a0 = (local_750.context)->instID[0];
                        uStack_19c = local_1a0;
                        uStack_198 = local_1a0;
                        uStack_194 = local_1a0;
                        uStack_190 = local_1a0;
                        uStack_18c = local_1a0;
                        uStack_188 = local_1a0;
                        uStack_184 = local_1a0;
                        local_180 = (local_750.context)->instPrimID[0];
                        uStack_17c = local_180;
                        uStack_178 = local_180;
                        uStack_174 = local_180;
                        uStack_170 = local_180;
                        uStack_16c = local_180;
                        uStack_168 = local_180;
                        uStack_164 = local_180;
                        local_660 = local_2c0._0_8_;
                        uStack_658 = local_2c0._8_8_;
                        uStack_650 = local_2c0._16_8_;
                        uStack_648 = local_2c0._24_8_;
                        local_750.valid = (int *)&local_660;
                        local_750.geometryUserPtr = pGVar10->userPtr;
                        local_750.hit = (RTCHitN *)&local_280;
                        local_750.N = 8;
                        local_750.ray = (RTCRayN *)ray;
                        if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar167 = ZEXT1664(auVar16);
                          auVar207 = ZEXT1664(auVar207._0_16_);
                          (*pGVar10->occlusionFilterN)(&local_750);
                        }
                        auVar74._8_8_ = uStack_658;
                        auVar74._0_8_ = local_660;
                        auVar74._16_8_ = uStack_650;
                        auVar74._24_8_ = uStack_648;
                        auVar105 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar74)
                        ;
                        auVar97 = _DAT_0205a980 & ~auVar105;
                        if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 && (auVar97 >> 0x3f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar97 >> 0x7f,0) == '\0') &&
                              (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                             SUB321(auVar97 >> 0xbf,0) == '\0') &&
                            (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar97[0x1f]) {
                          auVar105 = auVar105 ^ _DAT_0205a980;
                        }
                        else {
                          p_Var12 = context->args->filter;
                          if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar167 = ZEXT1664(auVar167._0_16_);
                            auVar207 = ZEXT1664(auVar207._0_16_);
                            (*p_Var12)(&local_750);
                          }
                          auVar75._8_8_ = uStack_658;
                          auVar75._0_8_ = local_660;
                          auVar75._16_8_ = uStack_650;
                          auVar75._24_8_ = uStack_648;
                          auVar97 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar75
                                                 );
                          auVar105 = auVar97 ^ _DAT_0205a980;
                          auVar140._8_4_ = 0xff800000;
                          auVar140._0_8_ = 0xff800000ff800000;
                          auVar140._12_4_ = 0xff800000;
                          auVar140._16_4_ = 0xff800000;
                          auVar140._20_4_ = 0xff800000;
                          auVar140._24_4_ = 0xff800000;
                          auVar140._28_4_ = 0xff800000;
                          auVar97 = vblendvps_avx(auVar140,*(undefined1 (*) [32])
                                                            (local_750.ray + 0x100),auVar97);
                          *(undefined1 (*) [32])(local_750.ray + 0x100) = auVar97;
                        }
                        if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar105 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar105 >> 0x7f,0) != '\0')
                              || (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar105 >> 0xbf,0) != '\0') ||
                            (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar105[0x1f] < '\0') break;
                        *(undefined4 *)(ray + k * 4 + 0x100) = uVar88;
                        lVar21 = 0;
                        local_8c0 = local_8c0 ^ 1L << (local_920._0_8_ & 0x3f);
                        for (uVar81 = local_8c0; (uVar81 & 1) == 0;
                            uVar81 = uVar81 >> 1 | 0x8000000000000000) {
                          lVar21 = lVar21 + 1;
                        }
                        local_920._0_8_ = lVar21;
                        local_6c0._0_4_ = (int)CONCAT71((int7)((ulong)lVar21 >> 8),local_8c0 != 0);
                      } while (local_8c0 != 0);
                    }
                    bVar84 = local_6c0[0] & 1;
                    auVar189 = ZEXT3264(CONCAT428(fStack_6c4,
                                                  CONCAT424(fStack_6c8,
                                                            CONCAT420(fStack_6cc,
                                                                      CONCAT416(fStack_6d0,
                                                                                CONCAT412(fStack_6d4
                                                                                          ,CONCAT48(
                                                  fStack_6d8,CONCAT44(fStack_6dc,local_6e0))))))));
                    auVar125 = ZEXT3264(CONCAT428(fVar148,CONCAT424(fVar141,CONCAT420(fVar148,
                                                  CONCAT416(fVar141,CONCAT412(fVar148,CONCAT48(
                                                  fVar141,uVar89)))))));
                  }
                }
                bVar78 = (bool)(bVar78 | bVar84);
              }
              auVar147 = ZEXT3264(local_6a0);
            }
          }
          lVar85 = lVar85 + 8;
        } while ((int)lVar85 < iVar79);
      }
      if (bVar78 != false) {
        return bVar87;
      }
      uVar88 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar94._4_4_ = uVar88;
      auVar94._0_4_ = uVar88;
      auVar94._8_4_ = uVar88;
      auVar94._12_4_ = uVar88;
      auVar155 = vcmpps_avx(local_460,auVar94,2);
      uVar82 = vmovmskps_avx(auVar155);
      uVar82 = (uint)uVar86 & uVar82;
      bVar87 = uVar82 != 0;
    } while (bVar87);
  }
  return bVar87;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }